

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<4,4>::
     intersect_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  Geometry *pGVar5;
  long lVar6;
  __int_type_conflict _Var7;
  RTCFilterFunctionN p_Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  bool bVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  ulong uVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  float fVar95;
  vint4 bi_2;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar101;
  undefined4 uVar102;
  float fVar108;
  float fVar109;
  vint4 bi_1;
  undefined1 auVar103 [16];
  float fVar110;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  vint4 bi;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  vint4 ai_2;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  vint4 ai;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  vint4 ai_1;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  vfloat4 a0_3;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  __m128 a_1;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  __m128 a;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  float fVar186;
  float fVar195;
  float fVar196;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar197;
  float fVar198;
  float fVar208;
  float fVar209;
  vfloat4 a0_1;
  undefined1 auVar199 [16];
  float fVar210;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar211;
  float fVar218;
  float fVar219;
  vfloat4 a0;
  undefined1 auVar212 [16];
  float fVar220;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_388 [16];
  RayQueryContext *local_370;
  ulong local_368;
  long local_360;
  RTCFilterFunctionNArguments local_358;
  undefined1 local_328 [16];
  uint auStack_318 [4];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [32];
  undefined8 uStack_128;
  RTCHitN local_108 [16];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ulong auStack_58 [5];
  ulong uVar22;
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  float fVar125;
  float fVar130;
  float fVar131;
  float fVar139;
  
  PVar3 = prim[1];
  uVar32 = (ulong)(byte)PVar3;
  fVar95 = *(float *)(prim + uVar32 * 0x19 + 0x12);
  auVar33 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar34 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar33 = vsubps_avx(auVar33,*(undefined1 (*) [16])(prim + uVar32 * 0x19 + 6));
  auVar52._0_4_ = fVar95 * auVar33._0_4_;
  auVar52._4_4_ = fVar95 * auVar33._4_4_;
  auVar52._8_4_ = fVar95 * auVar33._8_4_;
  auVar52._12_4_ = fVar95 * auVar33._12_4_;
  auVar42._0_4_ = fVar95 * auVar34._0_4_;
  auVar42._4_4_ = fVar95 * auVar34._4_4_;
  auVar42._8_4_ = fVar95 * auVar34._8_4_;
  auVar42._12_4_ = fVar95 * auVar34._12_4_;
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 * 4 + 6)));
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 * 5 + 6)));
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 * 6 + 6)));
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 * 0xb + 6)));
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar32 + 6)));
  auVar41 = vcvtdq2ps_avx(auVar41);
  uVar31 = (ulong)(uint)((int)(uVar32 * 9) * 2);
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar31 + 6)));
  auVar46 = vcvtdq2ps_avx(auVar46);
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar31 + uVar32 + 6)));
  auVar229 = vcvtdq2ps_avx(auVar229);
  uVar21 = (ulong)(uint)((int)(uVar32 * 5) << 2);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 + 6)));
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar57._4_4_ = auVar42._0_4_;
  auVar57._0_4_ = auVar42._0_4_;
  auVar57._8_4_ = auVar42._0_4_;
  auVar57._12_4_ = auVar42._0_4_;
  auVar37 = vshufps_avx(auVar42,auVar42,0x55);
  auVar36 = vshufps_avx(auVar42,auVar42,0xaa);
  fVar95 = auVar36._0_4_;
  auVar58._0_4_ = fVar95 * auVar35._0_4_;
  fVar197 = auVar36._4_4_;
  auVar58._4_4_ = fVar197 * auVar35._4_4_;
  fVar186 = auVar36._8_4_;
  auVar58._8_4_ = fVar186 * auVar35._8_4_;
  fVar195 = auVar36._12_4_;
  auVar58._12_4_ = fVar195 * auVar35._12_4_;
  auVar48._0_4_ = auVar41._0_4_ * fVar95;
  auVar48._4_4_ = auVar41._4_4_ * fVar197;
  auVar48._8_4_ = auVar41._8_4_ * fVar186;
  auVar48._12_4_ = auVar41._12_4_ * fVar195;
  auVar43._0_4_ = auVar38._0_4_ * fVar95;
  auVar43._4_4_ = auVar38._4_4_ * fVar197;
  auVar43._8_4_ = auVar38._8_4_ * fVar186;
  auVar43._12_4_ = auVar38._12_4_ * fVar195;
  auVar36 = vfmadd231ps_fma(auVar58,auVar37,auVar34);
  auVar39 = vfmadd231ps_fma(auVar48,auVar37,auVar45);
  auVar37 = vfmadd231ps_fma(auVar43,auVar229,auVar37);
  auVar40 = vfmadd231ps_fma(auVar36,auVar57,auVar33);
  auVar39 = vfmadd231ps_fma(auVar39,auVar57,auVar44);
  auVar42 = vfmadd231ps_fma(auVar37,auVar46,auVar57);
  auVar59._4_4_ = auVar52._0_4_;
  auVar59._0_4_ = auVar52._0_4_;
  auVar59._8_4_ = auVar52._0_4_;
  auVar59._12_4_ = auVar52._0_4_;
  auVar37 = vshufps_avx(auVar52,auVar52,0x55);
  auVar36 = vshufps_avx(auVar52,auVar52,0xaa);
  fVar95 = auVar36._0_4_;
  auVar60._0_4_ = fVar95 * auVar35._0_4_;
  fVar197 = auVar36._4_4_;
  auVar60._4_4_ = fVar197 * auVar35._4_4_;
  fVar186 = auVar36._8_4_;
  auVar60._8_4_ = fVar186 * auVar35._8_4_;
  fVar195 = auVar36._12_4_;
  auVar60._12_4_ = fVar195 * auVar35._12_4_;
  auVar53._0_4_ = auVar41._0_4_ * fVar95;
  auVar53._4_4_ = auVar41._4_4_ * fVar197;
  auVar53._8_4_ = auVar41._8_4_ * fVar186;
  auVar53._12_4_ = auVar41._12_4_ * fVar195;
  auVar55._0_4_ = auVar38._0_4_ * fVar95;
  auVar55._4_4_ = auVar38._4_4_ * fVar197;
  auVar55._8_4_ = auVar38._8_4_ * fVar186;
  auVar55._12_4_ = auVar38._12_4_ * fVar195;
  auVar34 = vfmadd231ps_fma(auVar60,auVar37,auVar34);
  auVar35 = vfmadd231ps_fma(auVar53,auVar37,auVar45);
  auVar45 = vfmadd231ps_fma(auVar55,auVar37,auVar229);
  auVar41 = vfmadd231ps_fma(auVar34,auVar59,auVar33);
  auVar229 = vfmadd231ps_fma(auVar35,auVar59,auVar44);
  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar235 = ZEXT1664(auVar33);
  auVar38 = vfmadd231ps_fma(auVar45,auVar59,auVar46);
  auVar34 = vandps_avx512vl(auVar40,auVar33);
  auVar49._8_4_ = 0x219392ef;
  auVar49._0_8_ = 0x219392ef219392ef;
  auVar49._12_4_ = 0x219392ef;
  uVar31 = vcmpps_avx512vl(auVar34,auVar49,1);
  bVar29 = (bool)((byte)uVar31 & 1);
  auVar36._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar40._0_4_;
  bVar29 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar36._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar40._4_4_;
  bVar29 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar36._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar40._8_4_;
  bVar29 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar36._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar40._12_4_;
  auVar34 = vandps_avx512vl(auVar39,auVar33);
  uVar31 = vcmpps_avx512vl(auVar34,auVar49,1);
  bVar29 = (bool)((byte)uVar31 & 1);
  auVar40._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar39._0_4_;
  bVar29 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar40._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar39._4_4_;
  bVar29 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar40._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar39._8_4_;
  bVar29 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar40._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar39._12_4_;
  auVar33 = vandps_avx512vl(auVar42,auVar33);
  uVar31 = vcmpps_avx512vl(auVar33,auVar49,1);
  bVar29 = (bool)((byte)uVar31 & 1);
  auVar39._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar42._0_4_;
  bVar29 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar39._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar42._4_4_;
  bVar29 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar39._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar42._8_4_;
  bVar29 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar39._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar42._12_4_;
  auVar33 = vrcp14ps_avx512vl(auVar36);
  auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar236 = ZEXT1664(auVar34);
  auVar35 = vfnmadd213ps_avx512vl(auVar36,auVar33,auVar34);
  auVar44 = vfmadd132ps_fma(auVar35,auVar33,auVar33);
  auVar33 = vrcp14ps_avx512vl(auVar40);
  auVar35 = vfnmadd213ps_avx512vl(auVar40,auVar33,auVar34);
  auVar45 = vfmadd132ps_fma(auVar35,auVar33,auVar33);
  auVar33 = vrcp14ps_avx512vl(auVar39);
  auVar34 = vfnmadd213ps_avx512vl(auVar39,auVar33,auVar34);
  auVar46 = vfmadd132ps_fma(auVar34,auVar33,auVar33);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar32 * 7 + 6);
  auVar33 = vpmovsxwd_avx(auVar33);
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar33 = vsubps_avx(auVar33,auVar41);
  auVar62._0_4_ = auVar44._0_4_ * auVar33._0_4_;
  auVar62._4_4_ = auVar44._4_4_ * auVar33._4_4_;
  auVar62._8_4_ = auVar44._8_4_ * auVar33._8_4_;
  auVar62._12_4_ = auVar44._12_4_ * auVar33._12_4_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar32 * 9 + 6);
  auVar33 = vpmovsxwd_avx(auVar34);
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar33 = vsubps_avx(auVar33,auVar41);
  auVar36 = vpbroadcastd_avx512vl();
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar34 = vpmovsxwd_avx(auVar35);
  auVar51._0_4_ = auVar44._0_4_ * auVar33._0_4_;
  auVar51._4_4_ = auVar44._4_4_ * auVar33._4_4_;
  auVar51._8_4_ = auVar44._8_4_ * auVar33._8_4_;
  auVar51._12_4_ = auVar44._12_4_ * auVar33._12_4_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar32 * -2 + 6);
  auVar33 = vpmovsxwd_avx(auVar44);
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar33 = vsubps_avx(auVar33,auVar229);
  auVar50._0_4_ = auVar45._0_4_ * auVar33._0_4_;
  auVar50._4_4_ = auVar45._4_4_ * auVar33._4_4_;
  auVar50._8_4_ = auVar45._8_4_ * auVar33._8_4_;
  auVar50._12_4_ = auVar45._12_4_ * auVar33._12_4_;
  auVar33 = vcvtdq2ps_avx(auVar34);
  auVar33 = vsubps_avx(auVar33,auVar229);
  auVar56._0_4_ = auVar45._0_4_ * auVar33._0_4_;
  auVar56._4_4_ = auVar45._4_4_ * auVar33._4_4_;
  auVar56._8_4_ = auVar45._8_4_ * auVar33._8_4_;
  auVar56._12_4_ = auVar45._12_4_ * auVar33._12_4_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar21 + uVar32 + 6);
  auVar33 = vpmovsxwd_avx(auVar45);
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar33 = vsubps_avx(auVar33,auVar38);
  auVar54._0_4_ = auVar46._0_4_ * auVar33._0_4_;
  auVar54._4_4_ = auVar46._4_4_ * auVar33._4_4_;
  auVar54._8_4_ = auVar46._8_4_ * auVar33._8_4_;
  auVar54._12_4_ = auVar46._12_4_ * auVar33._12_4_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar32 * 0x17 + 6);
  auVar33 = vpmovsxwd_avx(auVar41);
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar33 = vsubps_avx(auVar33,auVar38);
  auVar47._0_4_ = auVar46._0_4_ * auVar33._0_4_;
  auVar47._4_4_ = auVar46._4_4_ * auVar33._4_4_;
  auVar47._8_4_ = auVar46._8_4_ * auVar33._8_4_;
  auVar47._12_4_ = auVar46._12_4_ * auVar33._12_4_;
  auVar33 = vpminsd_avx(auVar62,auVar51);
  auVar34 = vpminsd_avx(auVar50,auVar56);
  auVar33 = vmaxps_avx(auVar33,auVar34);
  auVar34 = vpminsd_avx(auVar54,auVar47);
  uVar102 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar46._4_4_ = uVar102;
  auVar46._0_4_ = uVar102;
  auVar46._8_4_ = uVar102;
  auVar46._12_4_ = uVar102;
  auVar34 = vmaxps_avx512vl(auVar34,auVar46);
  auVar33 = vmaxps_avx(auVar33,auVar34);
  auVar229._8_4_ = 0x3f7ffffa;
  auVar229._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar229._12_4_ = 0x3f7ffffa;
  local_2d8 = vmulps_avx512vl(auVar33,auVar229);
  auVar33 = vpmaxsd_avx(auVar62,auVar51);
  auVar34 = vpmaxsd_avx(auVar50,auVar56);
  auVar33 = vminps_avx(auVar33,auVar34);
  auVar34 = vpmaxsd_avx(auVar54,auVar47);
  uVar102 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar38._4_4_ = uVar102;
  auVar38._0_4_ = uVar102;
  auVar38._8_4_ = uVar102;
  auVar38._12_4_ = uVar102;
  auVar34 = vminps_avx512vl(auVar34,auVar38);
  auVar33 = vminps_avx(auVar33,auVar34);
  auVar37._8_4_ = 0x3f800003;
  auVar37._0_8_ = 0x3f8000033f800003;
  auVar37._12_4_ = 0x3f800003;
  auVar33 = vmulps_avx512vl(auVar33,auVar37);
  uVar9 = vcmpps_avx512vl(local_2d8,auVar33,2);
  uVar31 = vpcmpgtd_avx512vl(auVar36,_DAT_01f7fcf0);
  uVar31 = ((byte)uVar9 & 0xf) & uVar31;
  if ((char)uVar31 != '\0') {
    local_308 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar230 = ZEXT1664(auVar33);
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar231 = ZEXT1664(auVar33);
    auVar238 = ZEXT464(0x3f800000);
    auVar33 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
    auVar237 = ZEXT1664(auVar33);
    do {
      lVar23 = 0;
      for (uVar21 = uVar31; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      uVar26 = *(uint *)(prim + 2);
      local_368 = (ulong)*(uint *)(prim + lVar23 * 4 + 6);
      pGVar5 = (context->scene->geometries).items[uVar26].ptr;
      lVar6 = *(long *)&pGVar5[1].time_range.upper;
      uVar21 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                               local_368 *
                               pGVar5[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      auVar33 = *(undefined1 (*) [16])(lVar6 + (long)pGVar5[1].intersectionFilterN * uVar21);
      lVar23 = uVar21 + 1;
      auVar34 = *(undefined1 (*) [16])(lVar6 + (long)pGVar5[1].intersectionFilterN * lVar23);
      _Var7 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar35 = *(undefined1 (*) [16])(_Var7 + (long)pGVar5[2].userPtr * uVar21);
      auVar44 = *(undefined1 (*) [16])(_Var7 + (long)pGVar5[2].userPtr * lVar23);
      auVar45 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      fVar95 = *(float *)(ray + k * 4 + 0x30);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
      auVar38 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            (pGVar5[2].intersectionFilterN + (long)pGVar5[2].pointQueryFunc * uVar21
                            ),auVar33,auVar37);
      auVar36 = vfnmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            (pGVar5[2].intersectionFilterN + (long)pGVar5[2].pointQueryFunc * lVar23
                            ),auVar34,auVar37);
      auVar39 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            ((long)pGVar5[3].userPtr + uVar21 * *(long *)&pGVar5[3].fnumTimeSegments
                            ),auVar35,auVar37);
      auVar40 = vfnmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            ((long)pGVar5[3].userPtr + *(long *)&pGVar5[3].fnumTimeSegments * lVar23
                            ),auVar44,auVar37);
      auVar47 = ZEXT816(0) << 0x40;
      auVar103._0_4_ = auVar34._0_4_ * 0.0;
      auVar103._4_4_ = auVar34._4_4_ * 0.0;
      auVar103._8_4_ = auVar34._8_4_ * 0.0;
      auVar103._12_4_ = auVar34._12_4_ * 0.0;
      auVar46 = vfmadd231ps_fma(auVar103,auVar36,auVar47);
      auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar38,auVar46);
      auVar111._0_4_ = auVar33._0_4_ + auVar41._0_4_;
      auVar111._4_4_ = auVar33._4_4_ + auVar41._4_4_;
      auVar111._8_4_ = auVar33._8_4_ + auVar41._8_4_;
      auVar111._12_4_ = auVar33._12_4_ + auVar41._12_4_;
      auVar48 = auVar230._0_16_;
      auVar41 = vfmadd231ps_avx512vl(auVar46,auVar38,auVar48);
      auVar42 = vfnmadd231ps_avx512vl(auVar41,auVar33,auVar48);
      auVar199._0_4_ = auVar44._0_4_ * 0.0;
      auVar199._4_4_ = auVar44._4_4_ * 0.0;
      auVar199._8_4_ = auVar44._8_4_ * 0.0;
      auVar199._12_4_ = auVar44._12_4_ * 0.0;
      auVar46 = vfmadd231ps_fma(auVar199,auVar40,auVar47);
      auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar39,auVar46);
      auVar212._0_4_ = auVar35._0_4_ + auVar41._0_4_;
      auVar212._4_4_ = auVar35._4_4_ + auVar41._4_4_;
      auVar212._8_4_ = auVar35._8_4_ + auVar41._8_4_;
      auVar212._12_4_ = auVar35._12_4_ + auVar41._12_4_;
      auVar41 = vfmadd231ps_avx512vl(auVar46,auVar39,auVar48);
      auVar43 = vfnmadd231ps_avx512vl(auVar41,auVar35,auVar48);
      auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar36,auVar34);
      auVar41 = vfmadd231ps_fma(auVar41,auVar38,auVar47);
      auVar229 = vfmadd231ps_fma(auVar41,auVar33,auVar47);
      auVar34 = vmulps_avx512vl(auVar34,auVar48);
      auVar34 = vfnmadd231ps_avx512vl(auVar34,auVar48,auVar36);
      auVar34 = vfmadd231ps_fma(auVar34,auVar47,auVar38);
      auVar38 = vfnmadd231ps_fma(auVar34,auVar47,auVar33);
      auVar33 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar40,auVar44);
      auVar33 = vfmadd231ps_fma(auVar33,auVar39,auVar47);
      auVar41 = vfmadd231ps_fma(auVar33,auVar35,auVar47);
      auVar33 = vmulps_avx512vl(auVar44,auVar48);
      auVar33 = vfnmadd231ps_avx512vl(auVar33,auVar48,auVar40);
      auVar33 = vfmadd231ps_fma(auVar33,auVar47,auVar39);
      auVar46 = vfnmadd231ps_fma(auVar33,auVar47,auVar35);
      auVar33 = vshufps_avx(auVar42,auVar42,0xc9);
      auVar34 = vshufps_avx(auVar212,auVar212,0xc9);
      fVar101 = auVar42._0_4_;
      auVar150._0_4_ = fVar101 * auVar34._0_4_;
      fVar108 = auVar42._4_4_;
      auVar150._4_4_ = fVar108 * auVar34._4_4_;
      fVar109 = auVar42._8_4_;
      auVar150._8_4_ = fVar109 * auVar34._8_4_;
      fVar110 = auVar42._12_4_;
      auVar150._12_4_ = fVar110 * auVar34._12_4_;
      auVar34 = vfmsub231ps_fma(auVar150,auVar33,auVar212);
      auVar35 = vshufps_avx(auVar34,auVar34,0xc9);
      auVar34 = vshufps_avx(auVar43,auVar43,0xc9);
      auVar166._0_4_ = auVar34._0_4_ * fVar101;
      auVar166._4_4_ = auVar34._4_4_ * fVar108;
      auVar166._8_4_ = auVar34._8_4_ * fVar109;
      auVar166._12_4_ = auVar34._12_4_ * fVar110;
      auVar33 = vfmsub231ps_fma(auVar166,auVar33,auVar43);
      auVar44 = vshufps_avx(auVar33,auVar33,0xc9);
      auVar33 = vshufps_avx(auVar38,auVar38,0xc9);
      auVar34 = vshufps_avx(auVar41,auVar41,0xc9);
      fVar197 = auVar38._0_4_;
      auVar177._0_4_ = auVar34._0_4_ * fVar197;
      fVar186 = auVar38._4_4_;
      auVar177._4_4_ = auVar34._4_4_ * fVar186;
      fVar195 = auVar38._8_4_;
      auVar177._8_4_ = auVar34._8_4_ * fVar195;
      fVar196 = auVar38._12_4_;
      auVar177._12_4_ = auVar34._12_4_ * fVar196;
      auVar34 = vfmsub231ps_fma(auVar177,auVar33,auVar41);
      auVar41 = vshufps_avx(auVar34,auVar34,0xc9);
      auVar34 = vshufps_avx(auVar46,auVar46,0xc9);
      auVar178._0_4_ = auVar34._0_4_ * fVar197;
      auVar178._4_4_ = auVar34._4_4_ * fVar186;
      auVar178._8_4_ = auVar34._8_4_ * fVar195;
      auVar178._12_4_ = auVar34._12_4_ * fVar196;
      auVar33 = vfmsub231ps_fma(auVar178,auVar33,auVar46);
      auVar46 = vshufps_avx(auVar33,auVar33,0xc9);
      auVar33 = vdpps_avx(auVar35,auVar35,0x7f);
      fVar125 = auVar33._0_4_;
      auVar179._4_12_ = ZEXT812(0) << 0x20;
      auVar179._0_4_ = fVar125;
      auVar34 = vrsqrt14ss_avx512f(auVar47,auVar179);
      auVar36 = vmulss_avx512f(auVar34,ZEXT416(0x3fc00000));
      auVar39 = vmulss_avx512f(auVar33,ZEXT416(0x3f000000));
      fVar130 = auVar34._0_4_;
      fVar131 = auVar36._0_4_ - auVar39._0_4_ * fVar130 * fVar130 * fVar130;
      auVar34 = vdpps_avx(auVar35,auVar44,0x7f);
      fVar211 = fVar131 * auVar35._0_4_;
      fVar218 = fVar131 * auVar35._4_4_;
      fVar219 = fVar131 * auVar35._8_4_;
      fVar220 = fVar131 * auVar35._12_4_;
      auVar167._0_4_ = fVar125 * auVar44._0_4_;
      auVar167._4_4_ = fVar125 * auVar44._4_4_;
      auVar167._8_4_ = fVar125 * auVar44._8_4_;
      auVar167._12_4_ = fVar125 * auVar44._12_4_;
      fVar125 = auVar34._0_4_;
      auVar151._0_4_ = fVar125 * auVar35._0_4_;
      auVar151._4_4_ = fVar125 * auVar35._4_4_;
      auVar151._8_4_ = fVar125 * auVar35._8_4_;
      auVar151._12_4_ = fVar125 * auVar35._12_4_;
      auVar35 = vsubps_avx(auVar167,auVar151);
      auVar34 = vrcp14ss_avx512f(auVar47,auVar179);
      auVar33 = vfnmadd213ss_avx512f(auVar33,auVar34,ZEXT416(0x40000000));
      fVar125 = auVar34._0_4_ * auVar33._0_4_;
      auVar33 = vdpps_avx(auVar41,auVar41,0x7f);
      fVar130 = auVar33._0_4_;
      auVar168._4_12_ = ZEXT812(0) << 0x20;
      auVar168._0_4_ = fVar130;
      auVar34 = vrsqrt14ss_avx512f(auVar47,auVar168);
      auVar44 = vmulss_avx512f(auVar34,ZEXT416(0x3fc00000));
      auVar36 = vmulss_avx512f(auVar33,ZEXT416(0x3f000000));
      fVar139 = auVar34._0_4_;
      fVar139 = auVar44._0_4_ - auVar36._0_4_ * fVar139 * fVar139 * fVar139;
      auVar34 = vdpps_avx(auVar41,auVar46,0x7f);
      fVar198 = fVar139 * auVar41._0_4_;
      fVar208 = fVar139 * auVar41._4_4_;
      fVar209 = fVar139 * auVar41._8_4_;
      fVar210 = fVar139 * auVar41._12_4_;
      auVar140._0_4_ = fVar130 * auVar46._0_4_;
      auVar140._4_4_ = fVar130 * auVar46._4_4_;
      auVar140._8_4_ = fVar130 * auVar46._8_4_;
      auVar140._12_4_ = fVar130 * auVar46._12_4_;
      fVar130 = auVar34._0_4_;
      auVar132._0_4_ = fVar130 * auVar41._0_4_;
      auVar132._4_4_ = fVar130 * auVar41._4_4_;
      auVar132._8_4_ = fVar130 * auVar41._8_4_;
      auVar132._12_4_ = fVar130 * auVar41._12_4_;
      auVar44 = vsubps_avx(auVar140,auVar132);
      auVar34 = vrcp14ss_avx512f(auVar47,auVar168);
      auVar33 = vfnmadd213ss_avx512f(auVar33,auVar34,ZEXT416(0x40000000));
      fVar130 = auVar33._0_4_ * auVar34._0_4_;
      auVar33 = vshufps_avx(auVar111,auVar111,0xff);
      auVar157._0_4_ = fVar211 * auVar33._0_4_;
      auVar157._4_4_ = fVar218 * auVar33._4_4_;
      auVar157._8_4_ = fVar219 * auVar33._8_4_;
      auVar157._12_4_ = fVar220 * auVar33._12_4_;
      local_218 = vsubps_avx(auVar111,auVar157);
      auVar34 = vshufps_avx(auVar42,auVar42,0xff);
      auVar141._0_4_ = auVar34._0_4_ * fVar211 + auVar33._0_4_ * fVar131 * fVar125 * auVar35._0_4_;
      auVar141._4_4_ = auVar34._4_4_ * fVar218 + auVar33._4_4_ * fVar131 * fVar125 * auVar35._4_4_;
      auVar141._8_4_ = auVar34._8_4_ * fVar219 + auVar33._8_4_ * fVar131 * fVar125 * auVar35._8_4_;
      auVar141._12_4_ =
           auVar34._12_4_ * fVar220 + auVar33._12_4_ * fVar131 * fVar125 * auVar35._12_4_;
      auVar35 = vsubps_avx(auVar42,auVar141);
      local_228._0_4_ = auVar157._0_4_ + auVar111._0_4_;
      local_228._4_4_ = auVar157._4_4_ + auVar111._4_4_;
      fStack_220 = auVar157._8_4_ + auVar111._8_4_;
      fStack_21c = auVar157._12_4_ + auVar111._12_4_;
      auVar104._0_4_ = fVar101 + auVar141._0_4_;
      auVar104._4_4_ = fVar108 + auVar141._4_4_;
      auVar104._8_4_ = fVar109 + auVar141._8_4_;
      auVar104._12_4_ = fVar110 + auVar141._12_4_;
      auVar33 = vshufps_avx(auVar229,auVar229,0xff);
      auVar142._0_4_ = fVar198 * auVar33._0_4_;
      auVar142._4_4_ = fVar208 * auVar33._4_4_;
      auVar142._8_4_ = fVar209 * auVar33._8_4_;
      auVar142._12_4_ = fVar210 * auVar33._12_4_;
      local_238 = vsubps_avx(auVar229,auVar142);
      auVar34 = vshufps_avx(auVar38,auVar38,0xff);
      auVar112._0_4_ = auVar34._0_4_ * fVar198 + auVar33._0_4_ * fVar139 * auVar44._0_4_ * fVar130;
      auVar112._4_4_ = auVar34._4_4_ * fVar208 + auVar33._4_4_ * fVar139 * auVar44._4_4_ * fVar130;
      auVar112._8_4_ = auVar34._8_4_ * fVar209 + auVar33._8_4_ * fVar139 * auVar44._8_4_ * fVar130;
      auVar112._12_4_ =
           auVar34._12_4_ * fVar210 + auVar33._12_4_ * fVar139 * auVar44._12_4_ * fVar130;
      auVar33 = vsubps_avx(auVar38,auVar112);
      _local_248 = vaddps_avx512vl(auVar229,auVar142);
      auVar113._0_4_ = fVar197 + auVar112._0_4_;
      auVar113._4_4_ = fVar186 + auVar112._4_4_;
      auVar113._8_4_ = fVar195 + auVar112._8_4_;
      auVar113._12_4_ = fVar196 + auVar112._12_4_;
      auVar34 = vmulps_avx512vl(auVar35,auVar37);
      local_258 = vaddps_avx512vl(local_218,auVar34);
      auVar33 = vmulps_avx512vl(auVar33,auVar37);
      local_268 = vsubps_avx512vl(local_238,auVar33);
      auVar33 = vmulps_avx512vl(auVar104,auVar37);
      _local_278 = vaddps_avx512vl(_local_228,auVar33);
      auVar33 = vmulps_avx512vl(auVar113,auVar37);
      _local_288 = vsubps_avx512vl(_local_248,auVar33);
      local_198 = vsubps_avx(local_218,auVar45);
      uVar102 = local_198._0_4_;
      auVar114._4_4_ = uVar102;
      auVar114._0_4_ = uVar102;
      auVar114._8_4_ = uVar102;
      auVar114._12_4_ = uVar102;
      auVar33 = vshufps_avx(local_198,local_198,0x55);
      auVar34 = vshufps_avx(local_198,local_198,0xaa);
      aVar1 = pre->ray_space[k].vx.field_0;
      aVar2 = pre->ray_space[k].vy.field_0;
      fVar197 = pre->ray_space[k].vz.field_0.m128[0];
      fVar186 = pre->ray_space[k].vz.field_0.m128[1];
      fVar195 = pre->ray_space[k].vz.field_0.m128[2];
      fVar196 = pre->ray_space[k].vz.field_0.m128[3];
      auVar105._0_4_ = fVar197 * auVar34._0_4_;
      auVar105._4_4_ = fVar186 * auVar34._4_4_;
      auVar105._8_4_ = fVar195 * auVar34._8_4_;
      auVar105._12_4_ = fVar196 * auVar34._12_4_;
      auVar33 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar2,auVar33);
      auVar41 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar114);
      local_1a8 = vsubps_avx512vl(local_258,auVar45);
      uVar102 = local_1a8._0_4_;
      auVar120._4_4_ = uVar102;
      auVar120._0_4_ = uVar102;
      auVar120._8_4_ = uVar102;
      auVar120._12_4_ = uVar102;
      auVar33 = vshufps_avx(local_1a8,local_1a8,0x55);
      auVar34 = vshufps_avx(local_1a8,local_1a8,0xaa);
      auVar115._0_4_ = fVar197 * auVar34._0_4_;
      auVar115._4_4_ = fVar186 * auVar34._4_4_;
      auVar115._8_4_ = fVar195 * auVar34._8_4_;
      auVar115._12_4_ = fVar196 * auVar34._12_4_;
      auVar33 = vfmadd231ps_fma(auVar115,(undefined1  [16])aVar2,auVar33);
      auVar46 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar120);
      local_1b8 = vsubps_avx512vl(local_268,auVar45);
      uVar102 = local_1b8._0_4_;
      auVar143._4_4_ = uVar102;
      auVar143._0_4_ = uVar102;
      auVar143._8_4_ = uVar102;
      auVar143._12_4_ = uVar102;
      auVar33 = vshufps_avx(local_1b8,local_1b8,0x55);
      auVar34 = vshufps_avx(local_1b8,local_1b8,0xaa);
      auVar121._0_4_ = fVar197 * auVar34._0_4_;
      auVar121._4_4_ = fVar186 * auVar34._4_4_;
      auVar121._8_4_ = fVar195 * auVar34._8_4_;
      auVar121._12_4_ = fVar196 * auVar34._12_4_;
      auVar33 = vfmadd231ps_fma(auVar121,(undefined1  [16])aVar2,auVar33);
      auVar229 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar143);
      local_1c8 = vsubps_avx(local_238,auVar45);
      uVar102 = local_1c8._0_4_;
      auVar158._4_4_ = uVar102;
      auVar158._0_4_ = uVar102;
      auVar158._8_4_ = uVar102;
      auVar158._12_4_ = uVar102;
      auVar33 = vshufps_avx(local_1c8,local_1c8,0x55);
      auVar34 = vshufps_avx(local_1c8,local_1c8,0xaa);
      auVar144._0_4_ = fVar197 * auVar34._0_4_;
      auVar144._4_4_ = fVar186 * auVar34._4_4_;
      auVar144._8_4_ = fVar195 * auVar34._8_4_;
      auVar144._12_4_ = fVar196 * auVar34._12_4_;
      auVar33 = vfmadd231ps_fma(auVar144,(undefined1  [16])aVar2,auVar33);
      auVar38 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar158);
      local_1d8 = vsubps_avx(_local_228,auVar45);
      uVar102 = local_1d8._0_4_;
      auVar159._4_4_ = uVar102;
      auVar159._0_4_ = uVar102;
      auVar159._8_4_ = uVar102;
      auVar159._12_4_ = uVar102;
      auVar33 = vshufps_avx(local_1d8,local_1d8,0x55);
      auVar34 = vshufps_avx(local_1d8,local_1d8,0xaa);
      auVar180._0_4_ = auVar34._0_4_ * fVar197;
      auVar180._4_4_ = auVar34._4_4_ * fVar186;
      auVar180._8_4_ = auVar34._8_4_ * fVar195;
      auVar180._12_4_ = auVar34._12_4_ * fVar196;
      auVar33 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar2,auVar33);
      auVar37 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar159);
      local_1e8 = vsubps_avx512vl(_local_278,auVar45);
      uVar102 = local_1e8._0_4_;
      auVar160._4_4_ = uVar102;
      auVar160._0_4_ = uVar102;
      auVar160._8_4_ = uVar102;
      auVar160._12_4_ = uVar102;
      auVar33 = vshufps_avx(local_1e8,local_1e8,0x55);
      auVar34 = vshufps_avx(local_1e8,local_1e8,0xaa);
      auVar187._0_4_ = auVar34._0_4_ * fVar197;
      auVar187._4_4_ = auVar34._4_4_ * fVar186;
      auVar187._8_4_ = auVar34._8_4_ * fVar195;
      auVar187._12_4_ = auVar34._12_4_ * fVar196;
      auVar33 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar2,auVar33);
      auVar36 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar160);
      local_1f8 = vsubps_avx512vl(_local_288,auVar45);
      uVar102 = local_1f8._0_4_;
      auVar161._4_4_ = uVar102;
      auVar161._0_4_ = uVar102;
      auVar161._8_4_ = uVar102;
      auVar161._12_4_ = uVar102;
      auVar33 = vshufps_avx(local_1f8,local_1f8,0x55);
      auVar34 = vshufps_avx(local_1f8,local_1f8,0xaa);
      auVar200._0_4_ = auVar34._0_4_ * fVar197;
      auVar200._4_4_ = auVar34._4_4_ * fVar186;
      auVar200._8_4_ = auVar34._8_4_ * fVar195;
      auVar200._12_4_ = auVar34._12_4_ * fVar196;
      auVar33 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar2,auVar33);
      auVar39 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar161);
      local_208 = vsubps_avx512vl(_local_248,auVar45);
      uVar102 = local_208._0_4_;
      auVar96._4_4_ = uVar102;
      auVar96._0_4_ = uVar102;
      auVar96._8_4_ = uVar102;
      auVar96._12_4_ = uVar102;
      auVar33 = vshufps_avx(local_208,local_208,0x55);
      auVar34 = vshufps_avx(local_208,local_208,0xaa);
      auVar152._0_4_ = auVar34._0_4_ * fVar197;
      auVar152._4_4_ = auVar34._4_4_ * fVar186;
      auVar152._8_4_ = auVar34._8_4_ * fVar195;
      auVar152._12_4_ = auVar34._12_4_ * fVar196;
      auVar33 = vfmadd231ps_fma(auVar152,(undefined1  [16])aVar2,auVar33);
      auVar40 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar96);
      auVar35 = vmovlhps_avx(auVar41,auVar37);
      auVar44 = vmovlhps_avx(auVar46,auVar36);
      local_328 = vmovlhps_avx512f(auVar229,auVar39);
      _local_158 = vmovlhps_avx512f(auVar38,auVar40);
      auVar34 = vminps_avx(auVar35,auVar44);
      auVar33 = vmaxps_avx(auVar35,auVar44);
      auVar45 = vminps_avx512vl(local_328,_local_158);
      auVar34 = vminps_avx(auVar34,auVar45);
      auVar45 = vmaxps_avx512vl(local_328,_local_158);
      auVar33 = vmaxps_avx(auVar33,auVar45);
      auVar45 = vshufpd_avx(auVar34,auVar34,3);
      auVar34 = vminps_avx(auVar34,auVar45);
      auVar45 = vshufpd_avx(auVar33,auVar33,3);
      auVar33 = vmaxps_avx(auVar33,auVar45);
      auVar34 = vandps_avx512vl(auVar34,auVar235._0_16_);
      auVar33 = vandps_avx512vl(auVar33,auVar235._0_16_);
      auVar33 = vmaxps_avx(auVar34,auVar33);
      auVar34 = vmovshdup_avx(auVar33);
      auVar33 = vmaxss_avx(auVar34,auVar33);
      local_360 = uVar31 + 0xf;
      auVar45 = vmovddup_avx512vl(auVar41);
      auVar41 = vmovddup_avx512vl(auVar46);
      auVar46 = vmovddup_avx512vl(auVar229);
      auVar106._8_8_ = auVar38._0_8_;
      auVar106._0_8_ = auVar38._0_8_;
      local_168 = ZEXT416((uint)(auVar33._0_4_ * 9.536743e-07));
      local_148 = vbroadcastss_avx512vl(local_168);
      auVar33 = vxorps_avx512vl(local_148._0_16_,auVar231._0_16_);
      local_78 = auVar33._0_4_;
      uStack_74 = local_78;
      uStack_70 = local_78;
      uStack_6c = local_78;
      uStack_68 = local_78;
      uStack_64 = local_78;
      uStack_60 = local_78;
      uStack_5c = local_78;
      uVar21 = 0;
      auVar33 = vsubps_avx(auVar44,auVar35);
      local_178 = vsubps_avx512vl(local_328,auVar44);
      local_188 = vsubps_avx512vl(_local_158,local_328);
      local_298 = vsubps_avx(_local_228,local_218);
      local_2a8 = vsubps_avx512vl(_local_278,local_258);
      local_2b8 = vsubps_avx512vl(_local_288,local_268);
      _local_2c8 = vsubps_avx512vl(_local_248,local_238);
      local_2e8 = vpbroadcastd_avx512vl();
      local_2f8 = vpbroadcastd_avx512vl();
      auVar34 = ZEXT816(0x3f80000000000000);
      auVar61 = auVar34;
LAB_01aaae91:
      auVar229 = vshufps_avx(auVar61,auVar61,0x50);
      auVar221._8_4_ = 0x3f800000;
      auVar221._0_8_ = 0x3f8000003f800000;
      auVar221._12_4_ = 0x3f800000;
      auVar83._16_4_ = 0x3f800000;
      auVar83._0_16_ = auVar221;
      auVar83._20_4_ = 0x3f800000;
      auVar83._24_4_ = 0x3f800000;
      auVar83._28_4_ = 0x3f800000;
      auVar38 = vsubps_avx(auVar221,auVar229);
      fVar197 = auVar229._0_4_;
      fVar125 = auVar37._0_4_;
      auVar126._0_4_ = fVar125 * fVar197;
      fVar186 = auVar229._4_4_;
      fVar130 = auVar37._4_4_;
      auVar126._4_4_ = fVar130 * fVar186;
      fVar195 = auVar229._8_4_;
      auVar126._8_4_ = fVar125 * fVar195;
      fVar196 = auVar229._12_4_;
      auVar126._12_4_ = fVar130 * fVar196;
      fVar131 = auVar36._0_4_;
      auVar133._0_4_ = fVar131 * fVar197;
      fVar139 = auVar36._4_4_;
      auVar133._4_4_ = fVar139 * fVar186;
      auVar133._8_4_ = fVar131 * fVar195;
      auVar133._12_4_ = fVar139 * fVar196;
      fVar101 = auVar39._0_4_;
      auVar145._0_4_ = fVar101 * fVar197;
      fVar108 = auVar39._4_4_;
      auVar145._4_4_ = fVar108 * fVar186;
      auVar145._8_4_ = fVar101 * fVar195;
      auVar145._12_4_ = fVar108 * fVar196;
      fVar109 = auVar40._0_4_;
      auVar116._0_4_ = fVar109 * fVar197;
      fVar110 = auVar40._4_4_;
      auVar116._4_4_ = fVar110 * fVar186;
      auVar116._8_4_ = fVar109 * fVar195;
      auVar116._12_4_ = fVar110 * fVar196;
      auVar42 = vfmadd231ps_avx512vl(auVar126,auVar38,auVar45);
      auVar43 = vfmadd231ps_avx512vl(auVar133,auVar38,auVar41);
      auVar47 = vfmadd231ps_avx512vl(auVar145,auVar38,auVar46);
      auVar38 = vfmadd231ps_fma(auVar116,auVar106,auVar38);
      auVar229 = vmovshdup_avx(auVar34);
      fVar186 = auVar34._0_4_;
      fVar197 = (auVar229._0_4_ - fVar186) * 0.04761905;
      auVar77._4_4_ = fVar186;
      auVar77._0_4_ = fVar186;
      auVar77._8_4_ = fVar186;
      auVar77._12_4_ = fVar186;
      auVar77._16_4_ = fVar186;
      auVar77._20_4_ = fVar186;
      auVar77._24_4_ = fVar186;
      auVar77._28_4_ = fVar186;
      auVar67._0_8_ = auVar229._0_8_;
      auVar67._8_8_ = auVar67._0_8_;
      auVar67._16_8_ = auVar67._0_8_;
      auVar67._24_8_ = auVar67._0_8_;
      auVar80 = vsubps_avx(auVar67,auVar77);
      uVar102 = auVar42._0_4_;
      auVar81._4_4_ = uVar102;
      auVar81._0_4_ = uVar102;
      auVar81._8_4_ = uVar102;
      auVar81._12_4_ = uVar102;
      auVar81._16_4_ = uVar102;
      auVar81._20_4_ = uVar102;
      auVar81._24_4_ = uVar102;
      auVar81._28_4_ = uVar102;
      auVar69._8_4_ = 1;
      auVar69._0_8_ = 0x100000001;
      auVar69._12_4_ = 1;
      auVar69._16_4_ = 1;
      auVar69._20_4_ = 1;
      auVar69._24_4_ = 1;
      auVar69._28_4_ = 1;
      auVar79 = ZEXT1632(auVar42);
      auVar78 = vpermps_avx2(auVar69,auVar79);
      auVar63 = vbroadcastss_avx512vl(auVar43);
      auVar73 = ZEXT1632(auVar43);
      auVar64 = vpermps_avx512vl(auVar69,auVar73);
      auVar65 = vbroadcastss_avx512vl(auVar47);
      auVar74 = ZEXT1632(auVar47);
      auVar66 = vpermps_avx512vl(auVar69,auVar74);
      auVar67 = vbroadcastss_avx512vl(auVar38);
      auVar76 = ZEXT1632(auVar38);
      auVar68 = vpermps_avx512vl(auVar69,auVar76);
      auVar82._4_4_ = fVar197;
      auVar82._0_4_ = fVar197;
      auVar82._8_4_ = fVar197;
      auVar82._12_4_ = fVar197;
      auVar82._16_4_ = fVar197;
      auVar82._20_4_ = fVar197;
      auVar82._24_4_ = fVar197;
      auVar82._28_4_ = fVar197;
      auVar75._8_4_ = 2;
      auVar75._0_8_ = 0x200000002;
      auVar75._12_4_ = 2;
      auVar75._16_4_ = 2;
      auVar75._20_4_ = 2;
      auVar75._24_4_ = 2;
      auVar75._28_4_ = 2;
      auVar69 = vpermps_avx512vl(auVar75,auVar79);
      auVar70 = vbroadcastss_avx512vl(ZEXT416(3));
      auVar71 = vpermps_avx512vl(auVar70,auVar79);
      auVar72 = vpermps_avx512vl(auVar75,auVar73);
      auVar73 = vpermps_avx512vl(auVar70,auVar73);
      auVar79 = vpermps_avx2(auVar75,auVar74);
      auVar74 = vpermps_avx512vl(auVar70,auVar74);
      auVar75 = vpermps_avx512vl(auVar75,auVar76);
      auVar70 = vpermps_avx512vl(auVar70,auVar76);
      auVar229 = vfmadd132ps_fma(auVar80,auVar77,_DAT_01faff20);
      auVar80 = vsubps_avx(auVar83,ZEXT1632(auVar229));
      auVar76 = vmulps_avx512vl(auVar63,ZEXT1632(auVar229));
      auVar83 = ZEXT1632(auVar229);
      auVar77 = vmulps_avx512vl(auVar64,auVar83);
      auVar38 = vfmadd231ps_fma(auVar76,auVar80,auVar81);
      auVar42 = vfmadd231ps_fma(auVar77,auVar80,auVar78);
      auVar76 = vmulps_avx512vl(auVar65,auVar83);
      auVar77 = vmulps_avx512vl(auVar66,auVar83);
      auVar76 = vfmadd231ps_avx512vl(auVar76,auVar80,auVar63);
      auVar77 = vfmadd231ps_avx512vl(auVar77,auVar80,auVar64);
      auVar63 = vmulps_avx512vl(auVar67,auVar83);
      auVar81 = ZEXT1632(auVar229);
      auVar64 = vmulps_avx512vl(auVar68,auVar81);
      auVar65 = vfmadd231ps_avx512vl(auVar63,auVar80,auVar65);
      auVar66 = vfmadd231ps_avx512vl(auVar64,auVar80,auVar66);
      fVar195 = auVar229._0_4_;
      fVar196 = auVar229._4_4_;
      auVar63._4_4_ = fVar196 * auVar76._4_4_;
      auVar63._0_4_ = fVar195 * auVar76._0_4_;
      fVar198 = auVar229._8_4_;
      auVar63._8_4_ = fVar198 * auVar76._8_4_;
      fVar208 = auVar229._12_4_;
      auVar63._12_4_ = fVar208 * auVar76._12_4_;
      auVar63._16_4_ = auVar76._16_4_ * 0.0;
      auVar63._20_4_ = auVar76._20_4_ * 0.0;
      auVar63._24_4_ = auVar76._24_4_ * 0.0;
      auVar63._28_4_ = fVar186;
      auVar64._4_4_ = fVar196 * auVar77._4_4_;
      auVar64._0_4_ = fVar195 * auVar77._0_4_;
      auVar64._8_4_ = fVar198 * auVar77._8_4_;
      auVar64._12_4_ = fVar208 * auVar77._12_4_;
      auVar64._16_4_ = auVar77._16_4_ * 0.0;
      auVar64._20_4_ = auVar77._20_4_ * 0.0;
      auVar64._24_4_ = auVar77._24_4_ * 0.0;
      auVar64._28_4_ = auVar78._28_4_;
      auVar38 = vfmadd231ps_fma(auVar63,auVar80,ZEXT1632(auVar38));
      auVar42 = vfmadd231ps_fma(auVar64,auVar80,ZEXT1632(auVar42));
      auVar68._0_4_ = fVar195 * auVar65._0_4_;
      auVar68._4_4_ = fVar196 * auVar65._4_4_;
      auVar68._8_4_ = fVar198 * auVar65._8_4_;
      auVar68._12_4_ = fVar208 * auVar65._12_4_;
      auVar68._16_4_ = auVar65._16_4_ * 0.0;
      auVar68._20_4_ = auVar65._20_4_ * 0.0;
      auVar68._24_4_ = auVar65._24_4_ * 0.0;
      auVar68._28_4_ = 0;
      auVar78._4_4_ = fVar196 * auVar66._4_4_;
      auVar78._0_4_ = fVar195 * auVar66._0_4_;
      auVar78._8_4_ = fVar198 * auVar66._8_4_;
      auVar78._12_4_ = fVar208 * auVar66._12_4_;
      auVar78._16_4_ = auVar66._16_4_ * 0.0;
      auVar78._20_4_ = auVar66._20_4_ * 0.0;
      auVar78._24_4_ = auVar66._24_4_ * 0.0;
      auVar78._28_4_ = auVar65._28_4_;
      auVar43 = vfmadd231ps_fma(auVar68,auVar80,auVar76);
      auVar47 = vfmadd231ps_fma(auVar78,auVar80,auVar77);
      auVar65._28_4_ = auVar77._28_4_;
      auVar65._0_28_ =
           ZEXT1628(CONCAT412(fVar208 * auVar47._12_4_,
                              CONCAT48(fVar198 * auVar47._8_4_,
                                       CONCAT44(fVar196 * auVar47._4_4_,fVar195 * auVar47._0_4_))));
      auVar48 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar208 * auVar43._12_4_,
                                                   CONCAT48(fVar198 * auVar43._8_4_,
                                                            CONCAT44(fVar196 * auVar43._4_4_,
                                                                     fVar195 * auVar43._0_4_)))),
                                auVar80,ZEXT1632(auVar38));
      auVar56 = vfmadd231ps_fma(auVar65,auVar80,ZEXT1632(auVar42));
      auVar78 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar38));
      auVar63 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar42));
      auVar64 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar78 = vmulps_avx512vl(auVar78,auVar64);
      auVar63 = vmulps_avx512vl(auVar63,auVar64);
      auVar76._0_4_ = fVar197 * auVar78._0_4_;
      auVar76._4_4_ = fVar197 * auVar78._4_4_;
      auVar76._8_4_ = fVar197 * auVar78._8_4_;
      auVar76._12_4_ = fVar197 * auVar78._12_4_;
      auVar76._16_4_ = fVar197 * auVar78._16_4_;
      auVar76._20_4_ = fVar197 * auVar78._20_4_;
      auVar76._24_4_ = fVar197 * auVar78._24_4_;
      auVar76._28_4_ = 0;
      auVar78 = vmulps_avx512vl(auVar82,auVar63);
      auVar42 = vxorps_avx512vl(auVar67._0_16_,auVar67._0_16_);
      auVar63 = vpermt2ps_avx512vl(ZEXT1632(auVar48),_DAT_01feed00,ZEXT1632(auVar42));
      auVar65 = vpermt2ps_avx512vl(ZEXT1632(auVar56),_DAT_01feed00,ZEXT1632(auVar42));
      auVar119._0_4_ = auVar76._0_4_ + auVar48._0_4_;
      auVar119._4_4_ = auVar76._4_4_ + auVar48._4_4_;
      auVar119._8_4_ = auVar76._8_4_ + auVar48._8_4_;
      auVar119._12_4_ = auVar76._12_4_ + auVar48._12_4_;
      auVar119._16_4_ = auVar76._16_4_ + 0.0;
      auVar119._20_4_ = auVar76._20_4_ + 0.0;
      auVar119._24_4_ = auVar76._24_4_ + 0.0;
      auVar119._28_4_ = 0;
      auVar77 = ZEXT1632(auVar42);
      auVar66 = vpermt2ps_avx512vl(auVar76,_DAT_01feed00,auVar77);
      auVar67 = vaddps_avx512vl(ZEXT1632(auVar56),auVar78);
      auVar68 = vpermt2ps_avx512vl(auVar78,_DAT_01feed00,auVar77);
      auVar78 = vsubps_avx(auVar63,auVar66);
      auVar68 = vsubps_avx512vl(auVar65,auVar68);
      auVar66 = vmulps_avx512vl(auVar72,auVar81);
      auVar76 = vmulps_avx512vl(auVar73,auVar81);
      auVar66 = vfmadd231ps_avx512vl(auVar66,auVar80,auVar69);
      auVar69 = vfmadd231ps_avx512vl(auVar76,auVar80,auVar71);
      auVar71 = vmulps_avx512vl(auVar79,auVar81);
      auVar76 = vmulps_avx512vl(auVar74,auVar81);
      auVar71 = vfmadd231ps_avx512vl(auVar71,auVar80,auVar72);
      auVar72 = vfmadd231ps_avx512vl(auVar76,auVar80,auVar73);
      auVar73 = vmulps_avx512vl(auVar75,auVar81);
      auVar70 = vmulps_avx512vl(auVar70,auVar81);
      auVar38 = vfmadd231ps_fma(auVar73,auVar80,auVar79);
      auVar79 = vfmadd231ps_avx512vl(auVar70,auVar80,auVar74);
      auVar70 = vmulps_avx512vl(auVar81,auVar71);
      auVar75 = ZEXT1632(auVar229);
      auVar73 = vmulps_avx512vl(auVar75,auVar72);
      auVar66 = vfmadd231ps_avx512vl(auVar70,auVar80,auVar66);
      auVar69 = vfmadd231ps_avx512vl(auVar73,auVar80,auVar69);
      auVar79 = vmulps_avx512vl(auVar75,auVar79);
      auVar70 = vfmadd231ps_avx512vl
                          (ZEXT1632(CONCAT412(fVar208 * auVar38._12_4_,
                                              CONCAT48(fVar198 * auVar38._8_4_,
                                                       CONCAT44(fVar196 * auVar38._4_4_,
                                                                fVar195 * auVar38._0_4_)))),auVar80,
                           auVar71);
      auVar71 = vfmadd231ps_avx512vl(auVar79,auVar80,auVar72);
      auVar79._4_4_ = fVar196 * auVar70._4_4_;
      auVar79._0_4_ = fVar195 * auVar70._0_4_;
      auVar79._8_4_ = fVar198 * auVar70._8_4_;
      auVar79._12_4_ = fVar208 * auVar70._12_4_;
      auVar79._16_4_ = auVar70._16_4_ * 0.0;
      auVar79._20_4_ = auVar70._20_4_ * 0.0;
      auVar79._24_4_ = auVar70._24_4_ * 0.0;
      auVar79._28_4_ = auVar74._28_4_;
      auVar72 = vmulps_avx512vl(auVar75,auVar71);
      auVar79 = vfmadd231ps_avx512vl(auVar79,auVar80,auVar66);
      auVar72 = vfmadd231ps_avx512vl(auVar72,auVar69,auVar80);
      auVar80 = vsubps_avx512vl(auVar70,auVar66);
      auVar66 = vsubps_avx512vl(auVar71,auVar69);
      auVar69 = vmulps_avx512vl(auVar80,auVar64);
      auVar64 = vmulps_avx512vl(auVar66,auVar64);
      fVar186 = fVar197 * auVar69._0_4_;
      fVar195 = fVar197 * auVar69._4_4_;
      auVar80._4_4_ = fVar195;
      auVar80._0_4_ = fVar186;
      fVar196 = fVar197 * auVar69._8_4_;
      auVar80._8_4_ = fVar196;
      fVar198 = fVar197 * auVar69._12_4_;
      auVar80._12_4_ = fVar198;
      fVar208 = fVar197 * auVar69._16_4_;
      auVar80._16_4_ = fVar208;
      fVar209 = fVar197 * auVar69._20_4_;
      auVar80._20_4_ = fVar209;
      fVar197 = fVar197 * auVar69._24_4_;
      auVar80._24_4_ = fVar197;
      auVar80._28_4_ = auVar69._28_4_;
      auVar64 = vmulps_avx512vl(auVar82,auVar64);
      auVar70 = vpermt2ps_avx512vl(auVar79,_DAT_01feed00,auVar77);
      auVar71 = vpermt2ps_avx512vl(auVar72,_DAT_01feed00,auVar77);
      auVar185._0_4_ = auVar79._0_4_ + fVar186;
      auVar185._4_4_ = auVar79._4_4_ + fVar195;
      auVar185._8_4_ = auVar79._8_4_ + fVar196;
      auVar185._12_4_ = auVar79._12_4_ + fVar198;
      auVar185._16_4_ = auVar79._16_4_ + fVar208;
      auVar185._20_4_ = auVar79._20_4_ + fVar209;
      auVar185._24_4_ = auVar79._24_4_ + fVar197;
      auVar185._28_4_ = auVar79._28_4_ + auVar69._28_4_;
      auVar80 = vpermt2ps_avx512vl(auVar80,_DAT_01feed00,ZEXT1632(auVar42));
      auVar69 = vaddps_avx512vl(auVar72,auVar64);
      auVar64 = vpermt2ps_avx512vl(auVar64,_DAT_01feed00,ZEXT1632(auVar42));
      auVar80 = vsubps_avx(auVar70,auVar80);
      auVar64 = vsubps_avx512vl(auVar71,auVar64);
      auVar84 = ZEXT1632(auVar48);
      auVar66 = vsubps_avx512vl(auVar79,auVar84);
      auVar86 = ZEXT1632(auVar56);
      auVar73 = vsubps_avx512vl(auVar72,auVar86);
      auVar74 = vsubps_avx512vl(auVar70,auVar63);
      auVar66 = vaddps_avx512vl(auVar66,auVar74);
      auVar74 = vsubps_avx512vl(auVar71,auVar65);
      auVar73 = vaddps_avx512vl(auVar73,auVar74);
      auVar74 = vmulps_avx512vl(auVar86,auVar66);
      auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar84,auVar73);
      auVar75 = vmulps_avx512vl(auVar67,auVar66);
      auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar119,auVar73);
      auVar76 = vmulps_avx512vl(auVar68,auVar66);
      auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar78,auVar73);
      auVar77 = vmulps_avx512vl(auVar65,auVar66);
      auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar63,auVar73);
      auVar81 = vmulps_avx512vl(auVar72,auVar66);
      auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar79,auVar73);
      auVar82 = vmulps_avx512vl(auVar69,auVar66);
      auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar185,auVar73);
      auVar83 = vmulps_avx512vl(auVar64,auVar66);
      auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar80,auVar73);
      auVar66 = vmulps_avx512vl(auVar71,auVar66);
      auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar70,auVar73);
      auVar73 = vminps_avx512vl(auVar74,auVar75);
      auVar74 = vmaxps_avx512vl(auVar74,auVar75);
      auVar75 = vminps_avx512vl(auVar76,auVar77);
      auVar73 = vminps_avx512vl(auVar73,auVar75);
      auVar75 = vmaxps_avx512vl(auVar76,auVar77);
      auVar74 = vmaxps_avx512vl(auVar74,auVar75);
      auVar75 = vminps_avx512vl(auVar81,auVar82);
      auVar76 = vmaxps_avx512vl(auVar81,auVar82);
      auVar77 = vminps_avx512vl(auVar83,auVar66);
      auVar75 = vminps_avx512vl(auVar75,auVar77);
      auVar73 = vminps_avx512vl(auVar73,auVar75);
      auVar66 = vmaxps_avx512vl(auVar83,auVar66);
      auVar66 = vmaxps_avx512vl(auVar76,auVar66);
      auVar74 = vmaxps_avx512vl(auVar74,auVar66);
      uVar9 = vcmpps_avx512vl(auVar73,local_148,2);
      auVar66._4_4_ = uStack_74;
      auVar66._0_4_ = local_78;
      auVar66._8_4_ = uStack_70;
      auVar66._12_4_ = uStack_6c;
      auVar66._16_4_ = uStack_68;
      auVar66._20_4_ = uStack_64;
      auVar66._24_4_ = uStack_60;
      auVar66._28_4_ = uStack_5c;
      uVar10 = vcmpps_avx512vl(auVar74,auVar66,5);
      bVar19 = (byte)uVar9 & (byte)uVar10 & 0x7f;
      if (bVar19 != 0) {
        auVar73 = vsubps_avx512vl(auVar63,auVar84);
        auVar74 = vsubps_avx512vl(auVar65,auVar86);
        auVar75 = vsubps_avx512vl(auVar70,auVar79);
        auVar73 = vaddps_avx512vl(auVar73,auVar75);
        auVar75 = vsubps_avx512vl(auVar71,auVar72);
        auVar74 = vaddps_avx512vl(auVar74,auVar75);
        auVar75 = vmulps_avx512vl(auVar86,auVar73);
        auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar74,auVar84);
        auVar67 = vmulps_avx512vl(auVar67,auVar73);
        auVar67 = vfnmadd213ps_avx512vl(auVar119,auVar74,auVar67);
        auVar68 = vmulps_avx512vl(auVar68,auVar73);
        auVar68 = vfnmadd213ps_avx512vl(auVar78,auVar74,auVar68);
        auVar78 = vmulps_avx512vl(auVar65,auVar73);
        auVar65 = vfnmadd231ps_avx512vl(auVar78,auVar74,auVar63);
        auVar78 = vmulps_avx512vl(auVar72,auVar73);
        auVar72 = vfnmadd231ps_avx512vl(auVar78,auVar74,auVar79);
        auVar78 = vmulps_avx512vl(auVar69,auVar73);
        auVar69 = vfnmadd213ps_avx512vl(auVar185,auVar74,auVar78);
        auVar78 = vmulps_avx512vl(auVar64,auVar73);
        auVar76 = vfnmadd213ps_avx512vl(auVar80,auVar74,auVar78);
        auVar80 = vmulps_avx512vl(auVar71,auVar73);
        auVar70 = vfnmadd231ps_avx512vl(auVar80,auVar70,auVar74);
        auVar78 = vminps_avx(auVar75,auVar67);
        auVar80 = vmaxps_avx(auVar75,auVar67);
        auVar63 = vminps_avx(auVar68,auVar65);
        auVar63 = vminps_avx(auVar78,auVar63);
        auVar78 = vmaxps_avx(auVar68,auVar65);
        auVar80 = vmaxps_avx(auVar80,auVar78);
        auVar79 = vminps_avx(auVar72,auVar69);
        auVar78 = vmaxps_avx(auVar72,auVar69);
        auVar64 = vminps_avx(auVar76,auVar70);
        auVar79 = vminps_avx(auVar79,auVar64);
        auVar79 = vminps_avx(auVar63,auVar79);
        auVar63 = vmaxps_avx(auVar76,auVar70);
        auVar78 = vmaxps_avx(auVar78,auVar63);
        auVar80 = vmaxps_avx(auVar80,auVar78);
        uVar9 = vcmpps_avx512vl(auVar80,auVar66,5);
        uVar10 = vcmpps_avx512vl(auVar79,local_148,2);
        bVar19 = bVar19 & (byte)uVar9 & (byte)uVar10;
        if (bVar19 != 0) {
          auStack_318[uVar21] = (uint)bVar19;
          uVar9 = vmovlps_avx(auVar34);
          (&uStack_128)[uVar21] = uVar9;
          uVar32 = vmovlps_avx(auVar61);
          auStack_58[uVar21] = uVar32;
          uVar21 = (ulong)((int)uVar21 + 1);
        }
      }
      auVar34 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar230 = ZEXT1664(auVar34);
      auVar34 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar231 = ZEXT1664(auVar34);
      auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar232 = ZEXT3264(auVar80);
      auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar233 = ZEXT1664(auVar34);
      auVar234 = ZEXT3264(_DAT_01feed20);
      if ((int)uVar21 != 0) {
        do {
          auVar38 = auVar236._0_16_;
          auVar229 = auVar230._0_16_;
          uVar20 = (int)uVar21 - 1;
          uVar22 = (ulong)uVar20;
          uVar4 = auStack_318[uVar22];
          auVar61._8_8_ = 0;
          auVar61._0_8_ = auStack_58[uVar22];
          uVar32 = 0;
          for (uVar25 = (ulong)uVar4; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000)
          {
            uVar32 = uVar32 + 1;
          }
          uVar24 = uVar4 - 1 & uVar4;
          bVar29 = uVar24 == 0;
          auStack_318[uVar22] = uVar24;
          if (bVar29) {
            uVar21 = (ulong)uVar20;
          }
          auVar97._8_8_ = 0;
          auVar97._0_8_ = uVar32;
          auVar34 = vpunpcklqdq_avx(auVar97,ZEXT416((int)uVar32 + 1));
          auVar34 = vcvtqq2ps_avx512vl(auVar34);
          auVar34 = vmulps_avx512vl(auVar34,auVar233._0_16_);
          uVar102 = *(undefined4 *)((long)&uStack_128 + uVar22 * 8 + 4);
          auVar11._4_4_ = uVar102;
          auVar11._0_4_ = uVar102;
          auVar11._8_4_ = uVar102;
          auVar11._12_4_ = uVar102;
          auVar42 = vmulps_avx512vl(auVar34,auVar11);
          auVar34 = vsubps_avx512vl(auVar38,auVar34);
          uVar102 = *(undefined4 *)(&uStack_128 + uVar22);
          auVar12._4_4_ = uVar102;
          auVar12._0_4_ = uVar102;
          auVar12._8_4_ = uVar102;
          auVar12._12_4_ = uVar102;
          auVar34 = vfmadd231ps_avx512vl(auVar42,auVar34,auVar12);
          auVar42 = vmovshdup_avx(auVar34);
          fVar197 = auVar42._0_4_ - auVar34._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar197));
          if (uVar4 == 0 || bVar29) goto LAB_01aaae91;
          auVar42 = vshufps_avx(auVar61,auVar61,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar197));
          uVar20 = (uint)uVar21;
          auVar48 = vsubps_avx512vl(auVar38,auVar42);
          fVar186 = auVar42._0_4_;
          auVar134._0_4_ = fVar186 * fVar125;
          fVar195 = auVar42._4_4_;
          auVar134._4_4_ = fVar195 * fVar130;
          fVar196 = auVar42._8_4_;
          auVar134._8_4_ = fVar196 * fVar125;
          fVar198 = auVar42._12_4_;
          auVar134._12_4_ = fVar198 * fVar130;
          auVar146._0_4_ = fVar186 * fVar131;
          auVar146._4_4_ = fVar195 * fVar139;
          auVar146._8_4_ = fVar196 * fVar131;
          auVar146._12_4_ = fVar198 * fVar139;
          auVar153._0_4_ = fVar186 * fVar101;
          auVar153._4_4_ = fVar195 * fVar108;
          auVar153._8_4_ = fVar196 * fVar101;
          auVar153._12_4_ = fVar198 * fVar108;
          auVar122._0_4_ = fVar186 * fVar109;
          auVar122._4_4_ = fVar195 * fVar110;
          auVar122._8_4_ = fVar196 * fVar109;
          auVar122._12_4_ = fVar198 * fVar110;
          auVar42 = vfmadd231ps_fma(auVar134,auVar48,auVar45);
          auVar43 = vfmadd231ps_fma(auVar146,auVar48,auVar41);
          auVar47 = vfmadd231ps_fma(auVar153,auVar48,auVar46);
          auVar48 = vfmadd231ps_fma(auVar122,auVar106,auVar48);
          auVar71._16_16_ = auVar42;
          auVar71._0_16_ = auVar42;
          auVar72._16_16_ = auVar43;
          auVar72._0_16_ = auVar43;
          auVar74._16_16_ = auVar47;
          auVar74._0_16_ = auVar47;
          auVar78 = vpermps_avx512vl(auVar234._0_32_,ZEXT1632(auVar34));
          auVar80 = vsubps_avx(auVar72,auVar71);
          auVar43 = vfmadd213ps_fma(auVar80,auVar78,auVar71);
          auVar80 = vsubps_avx(auVar74,auVar72);
          auVar56 = vfmadd213ps_fma(auVar80,auVar78,auVar72);
          auVar42 = vsubps_avx(auVar48,auVar47);
          auVar73._16_16_ = auVar42;
          auVar73._0_16_ = auVar42;
          auVar42 = vfmadd213ps_fma(auVar73,auVar78,auVar74);
          auVar80 = vsubps_avx(ZEXT1632(auVar56),ZEXT1632(auVar43));
          auVar43 = vfmadd213ps_fma(auVar80,auVar78,ZEXT1632(auVar43));
          auVar80 = vsubps_avx(ZEXT1632(auVar42),ZEXT1632(auVar56));
          auVar42 = vfmadd213ps_fma(auVar80,auVar78,ZEXT1632(auVar56));
          auVar80 = vsubps_avx(ZEXT1632(auVar42),ZEXT1632(auVar43));
          auVar62 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar80,auVar78);
          auVar80 = vmulps_avx512vl(auVar80,auVar232._0_32_);
          auVar70._16_16_ = auVar80._16_16_;
          auVar42 = vmulss_avx512f(ZEXT416((uint)fVar197),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar186 = auVar42._0_4_;
          auVar154._0_8_ =
               CONCAT44(auVar62._4_4_ + fVar186 * auVar80._4_4_,
                        auVar62._0_4_ + fVar186 * auVar80._0_4_);
          auVar154._8_4_ = auVar62._8_4_ + fVar186 * auVar80._8_4_;
          auVar154._12_4_ = auVar62._12_4_ + fVar186 * auVar80._12_4_;
          auVar135._0_4_ = fVar186 * auVar80._16_4_;
          auVar135._4_4_ = fVar186 * auVar80._20_4_;
          auVar135._8_4_ = fVar186 * auVar80._24_4_;
          auVar135._12_4_ = fVar186 * auVar80._28_4_;
          auVar55 = vsubps_avx((undefined1  [16])0x0,auVar135);
          auVar56 = vshufpd_avx(auVar62,auVar62,3);
          auVar58 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar42 = vsubps_avx(auVar56,auVar62);
          auVar43 = vsubps_avx(auVar58,(undefined1  [16])0x0);
          auVar169._0_4_ = auVar42._0_4_ + auVar43._0_4_;
          auVar169._4_4_ = auVar42._4_4_ + auVar43._4_4_;
          auVar169._8_4_ = auVar42._8_4_ + auVar43._8_4_;
          auVar169._12_4_ = auVar42._12_4_ + auVar43._12_4_;
          auVar42 = vshufps_avx(auVar62,auVar62,0xb1);
          auVar43 = vshufps_avx(auVar154,auVar154,0xb1);
          auVar47 = vshufps_avx(auVar55,auVar55,0xb1);
          auVar48 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar222._4_4_ = auVar169._0_4_;
          auVar222._0_4_ = auVar169._0_4_;
          auVar222._8_4_ = auVar169._0_4_;
          auVar222._12_4_ = auVar169._0_4_;
          auVar51 = vshufps_avx(auVar169,auVar169,0x55);
          fVar186 = auVar51._0_4_;
          auVar181._0_4_ = auVar42._0_4_ * fVar186;
          fVar195 = auVar51._4_4_;
          auVar181._4_4_ = auVar42._4_4_ * fVar195;
          fVar196 = auVar51._8_4_;
          auVar181._8_4_ = auVar42._8_4_ * fVar196;
          fVar198 = auVar51._12_4_;
          auVar181._12_4_ = auVar42._12_4_ * fVar198;
          auVar188._0_4_ = auVar43._0_4_ * fVar186;
          auVar188._4_4_ = auVar43._4_4_ * fVar195;
          auVar188._8_4_ = auVar43._8_4_ * fVar196;
          auVar188._12_4_ = auVar43._12_4_ * fVar198;
          auVar201._0_4_ = auVar47._0_4_ * fVar186;
          auVar201._4_4_ = auVar47._4_4_ * fVar195;
          auVar201._8_4_ = auVar47._8_4_ * fVar196;
          auVar201._12_4_ = auVar47._12_4_ * fVar198;
          auVar170._0_4_ = auVar48._0_4_ * fVar186;
          auVar170._4_4_ = auVar48._4_4_ * fVar195;
          auVar170._8_4_ = auVar48._8_4_ * fVar196;
          auVar170._12_4_ = auVar48._12_4_ * fVar198;
          auVar42 = vfmadd231ps_fma(auVar181,auVar222,auVar62);
          auVar43 = vfmadd231ps_fma(auVar188,auVar222,auVar154);
          auVar53 = vfmadd231ps_fma(auVar201,auVar222,auVar55);
          auVar54 = vfmadd231ps_fma(auVar170,(undefined1  [16])0x0,auVar222);
          auVar51 = vshufpd_avx(auVar42,auVar42,1);
          auVar52 = vshufpd_avx(auVar43,auVar43,1);
          auVar49 = vshufpd_avx512vl(auVar53,auVar53,1);
          auVar50 = vshufpd_avx512vl(auVar54,auVar54,1);
          auVar47 = vminss_avx(auVar42,auVar43);
          auVar42 = vmaxss_avx(auVar43,auVar42);
          auVar48 = vminss_avx(auVar53,auVar54);
          auVar43 = vmaxss_avx(auVar54,auVar53);
          auVar47 = vminss_avx(auVar47,auVar48);
          auVar42 = vmaxss_avx(auVar43,auVar42);
          auVar48 = vminss_avx(auVar51,auVar52);
          auVar43 = vmaxss_avx(auVar52,auVar51);
          auVar51 = vminss_avx512f(auVar49,auVar50);
          auVar52 = vmaxss_avx512f(auVar50,auVar49);
          auVar43 = vmaxss_avx(auVar52,auVar43);
          auVar48 = vminss_avx512f(auVar48,auVar51);
          vucomiss_avx512f(auVar47);
          fVar195 = auVar43._0_4_;
          fVar186 = auVar42._0_4_;
          if (uVar20 < 5) {
LAB_01aab5c0:
            auVar51 = vucomiss_avx512f(auVar48);
            bVar30 = fVar195 <= -0.0001;
            bVar28 = -0.0001 < fVar186;
            bVar27 = bVar30;
            if (!bVar30) goto LAB_01aab606;
            uVar9 = vcmpps_avx512vl(auVar47,auVar51,5);
            uVar10 = vcmpps_avx512vl(auVar48,auVar51,5);
            uVar24 = (uint)uVar9 & (uint)uVar10;
            bVar15 = (uVar24 & 1) == 0;
            bVar30 = bVar28 && bVar15;
            bVar27 = bVar28 && (uVar24 & 1) == 0;
            if (bVar28 && bVar15) goto LAB_01aab606;
          }
          else {
            bVar30 = fVar195 == -0.0001;
            bVar27 = NAN(fVar195);
            if (fVar195 <= -0.0001) goto LAB_01aab5c0;
LAB_01aab606:
            auVar53 = auVar237._0_16_;
            vcmpss_avx512f(auVar47,auVar53,1);
            uVar9 = vcmpss_avx512f(auVar42,auVar53,1);
            bVar28 = (bool)((byte)uVar9 & 1);
            auVar70._0_16_ = auVar238._0_16_;
            auVar84._4_28_ = auVar70._4_28_;
            auVar84._0_4_ = (float)((uint)bVar28 * -0x40800000 + (uint)!bVar28 * auVar238._0_4_);
            vucomiss_avx512f(auVar84._0_16_);
            bVar27 = (bool)(!bVar30 | bVar27);
            bVar28 = bVar27 == false;
            auVar86._16_16_ = auVar70._16_16_;
            auVar86._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar85._4_28_ = auVar86._4_28_;
            auVar85._0_4_ = (uint)bVar27 * auVar237._0_4_ + (uint)!bVar27 * 0x7f800000;
            auVar52 = auVar85._0_16_;
            auVar88._16_16_ = auVar70._16_16_;
            auVar88._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar87._4_28_ = auVar88._4_28_;
            auVar87._0_4_ = (uint)bVar27 * auVar237._0_4_ + (uint)!bVar27 * -0x800000;
            auVar51 = auVar87._0_16_;
            uVar9 = vcmpss_avx512f(auVar48,auVar53,1);
            bVar30 = (bool)((byte)uVar9 & 1);
            auVar90._16_16_ = auVar70._16_16_;
            auVar90._0_16_ = auVar238._0_16_;
            auVar89._4_28_ = auVar90._4_28_;
            auVar89._0_4_ = (float)((uint)bVar30 * -0x40800000 + (uint)!bVar30 * auVar238._0_4_);
            vucomiss_avx512f(auVar89._0_16_);
            if ((bVar27) || (bVar28)) {
              auVar48 = vucomiss_avx512f(auVar47);
              if ((bVar27) || (bVar28)) {
                auVar54 = vxorps_avx512vl(auVar47,auVar231._0_16_);
                auVar47 = vsubss_avx512f(auVar48,auVar47);
                auVar47 = vdivss_avx512f(auVar54,auVar47);
                auVar48 = vsubss_avx512f(ZEXT416(0x3f800000),auVar47);
                auVar48 = vfmadd213ss_avx512f(auVar48,auVar53,auVar47);
                auVar47 = auVar48;
              }
              else {
                auVar48 = vxorps_avx512vl(auVar48,auVar48);
                vucomiss_avx512f(auVar48);
                if ((bVar27) || (auVar47 = ZEXT416(0x3f800000), bVar28)) {
                  auVar48 = ZEXT416(0x7f800000);
                  auVar47 = SUB6416(ZEXT464(0xff800000),0);
                }
              }
              auVar52 = vminss_avx512f(auVar52,auVar48);
              auVar51 = vmaxss_avx(auVar47,auVar51);
            }
            auVar238 = ZEXT464(0x3f800000);
            uVar9 = vcmpss_avx512f(auVar43,auVar53,1);
            bVar30 = (bool)((byte)uVar9 & 1);
            auVar43 = auVar238._0_16_;
            fVar196 = (float)((uint)bVar30 * -0x40800000 + (uint)!bVar30 * 0x3f800000);
            if ((auVar84._0_4_ != fVar196) || (NAN(auVar84._0_4_) || NAN(fVar196))) {
              if ((fVar195 != fVar186) || (NAN(fVar195) || NAN(fVar186))) {
                auVar42 = vxorps_avx512vl(auVar42,auVar231._0_16_);
                auVar171._0_4_ = auVar42._0_4_ / (fVar195 - fVar186);
                auVar171._4_12_ = auVar42._4_12_;
                auVar42 = vsubss_avx512f(auVar43,auVar171);
                auVar42 = vfmadd213ss_avx512f(auVar42,auVar53,auVar171);
                auVar47 = auVar42;
              }
              else if ((fVar186 != 0.0) ||
                      (auVar42 = auVar43, auVar47 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar186))) {
                auVar42 = SUB6416(ZEXT464(0xff800000),0);
                auVar47 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar52 = vminss_avx(auVar52,auVar47);
              auVar51 = vmaxss_avx(auVar42,auVar51);
            }
            bVar30 = auVar89._0_4_ != fVar196;
            auVar42 = vminss_avx512f(auVar52,auVar43);
            auVar92._16_16_ = auVar70._16_16_;
            auVar92._0_16_ = auVar52;
            auVar91._4_28_ = auVar92._4_28_;
            auVar91._0_4_ = (uint)bVar30 * auVar42._0_4_ + (uint)!bVar30 * auVar52._0_4_;
            auVar42 = vmaxss_avx512f(auVar43,auVar51);
            auVar94._16_16_ = auVar70._16_16_;
            auVar94._0_16_ = auVar51;
            auVar93._4_28_ = auVar94._4_28_;
            auVar93._0_4_ = (uint)bVar30 * auVar42._0_4_ + (uint)!bVar30 * auVar51._0_4_;
            auVar42 = vmaxss_avx512f(auVar53,auVar91._0_16_);
            auVar47 = vminss_avx512f(auVar93._0_16_,auVar43);
            if (auVar42._0_4_ <= auVar47._0_4_) {
              auVar53 = vmaxss_avx512f(auVar53,ZEXT416((uint)(auVar42._0_4_ + -0.1)));
              auVar54 = vminss_avx512f(ZEXT416((uint)(auVar47._0_4_ + 0.1)),auVar43);
              auVar123._0_8_ = auVar62._0_8_;
              auVar123._8_8_ = auVar123._0_8_;
              auVar189._8_8_ = auVar154._0_8_;
              auVar189._0_8_ = auVar154._0_8_;
              auVar202._8_8_ = auVar55._0_8_;
              auVar202._0_8_ = auVar55._0_8_;
              auVar42 = vshufpd_avx(auVar154,auVar154,3);
              auVar47 = vshufpd_avx(auVar55,auVar55,3);
              auVar48 = vshufps_avx(auVar53,auVar54,0);
              auVar55 = vsubps_avx512vl(auVar38,auVar48);
              fVar186 = auVar48._0_4_;
              auVar147._0_4_ = fVar186 * auVar56._0_4_;
              fVar195 = auVar48._4_4_;
              auVar147._4_4_ = fVar195 * auVar56._4_4_;
              fVar196 = auVar48._8_4_;
              auVar147._8_4_ = fVar196 * auVar56._8_4_;
              fVar198 = auVar48._12_4_;
              auVar147._12_4_ = fVar198 * auVar56._12_4_;
              auVar155._0_4_ = fVar186 * auVar42._0_4_;
              auVar155._4_4_ = fVar195 * auVar42._4_4_;
              auVar155._8_4_ = fVar196 * auVar42._8_4_;
              auVar155._12_4_ = fVar198 * auVar42._12_4_;
              auVar224._0_4_ = auVar47._0_4_ * fVar186;
              auVar224._4_4_ = auVar47._4_4_ * fVar195;
              auVar224._8_4_ = auVar47._8_4_ * fVar196;
              auVar224._12_4_ = auVar47._12_4_ * fVar198;
              auVar136._0_4_ = fVar186 * auVar58._0_4_;
              auVar136._4_4_ = fVar195 * auVar58._4_4_;
              auVar136._8_4_ = fVar196 * auVar58._8_4_;
              auVar136._12_4_ = fVar198 * auVar58._12_4_;
              auVar58 = vfmadd231ps_fma(auVar147,auVar55,auVar123);
              auVar51 = vfmadd231ps_fma(auVar155,auVar55,auVar189);
              auVar52 = vfmadd231ps_fma(auVar224,auVar55,auVar202);
              auVar55 = vfmadd231ps_fma(auVar136,auVar55,ZEXT816(0));
              auVar47 = vsubss_avx512f(auVar43,auVar53);
              auVar42 = vmovshdup_avx(auVar61);
              auVar49 = vfmadd231ss_fma(ZEXT416((uint)(auVar42._0_4_ * auVar53._0_4_)),auVar61,
                                        auVar47);
              auVar47 = vsubss_avx512f(auVar43,auVar54);
              auVar50 = vfmadd231ss_fma(ZEXT416((uint)(auVar42._0_4_ * auVar54._0_4_)),auVar61,
                                        auVar47);
              auVar53 = vdivss_avx512f(auVar43,ZEXT416((uint)fVar197));
              auVar42 = vsubps_avx(auVar51,auVar58);
              auVar48 = vmulps_avx512vl(auVar42,auVar229);
              auVar42 = vsubps_avx(auVar52,auVar51);
              auVar56 = vmulps_avx512vl(auVar42,auVar229);
              auVar42 = vsubps_avx(auVar55,auVar52);
              auVar42 = vmulps_avx512vl(auVar42,auVar229);
              auVar47 = vminps_avx(auVar56,auVar42);
              auVar42 = vmaxps_avx(auVar56,auVar42);
              auVar47 = vminps_avx(auVar48,auVar47);
              auVar42 = vmaxps_avx(auVar48,auVar42);
              auVar48 = vshufpd_avx(auVar47,auVar47,3);
              auVar56 = vshufpd_avx(auVar42,auVar42,3);
              auVar47 = vminps_avx(auVar47,auVar48);
              auVar42 = vmaxps_avx(auVar42,auVar56);
              fVar197 = auVar53._0_4_;
              auVar172._0_4_ = auVar47._0_4_ * fVar197;
              auVar172._4_4_ = auVar47._4_4_ * fVar197;
              auVar172._8_4_ = auVar47._8_4_ * fVar197;
              auVar172._12_4_ = auVar47._12_4_ * fVar197;
              auVar162._0_4_ = fVar197 * auVar42._0_4_;
              auVar162._4_4_ = fVar197 * auVar42._4_4_;
              auVar162._8_4_ = fVar197 * auVar42._8_4_;
              auVar162._12_4_ = fVar197 * auVar42._12_4_;
              auVar53 = vdivss_avx512f(auVar43,ZEXT416((uint)(auVar50._0_4_ - auVar49._0_4_)));
              auVar42 = vshufpd_avx(auVar58,auVar58,3);
              auVar47 = vshufpd_avx(auVar51,auVar51,3);
              auVar48 = vshufpd_avx(auVar52,auVar52,3);
              auVar56 = vshufpd_avx(auVar55,auVar55,3);
              auVar42 = vsubps_avx(auVar42,auVar58);
              auVar58 = vsubps_avx(auVar47,auVar51);
              auVar51 = vsubps_avx(auVar48,auVar52);
              auVar56 = vsubps_avx(auVar56,auVar55);
              auVar47 = vminps_avx(auVar42,auVar58);
              auVar42 = vmaxps_avx(auVar42,auVar58);
              auVar48 = vminps_avx(auVar51,auVar56);
              auVar48 = vminps_avx(auVar47,auVar48);
              auVar47 = vmaxps_avx(auVar51,auVar56);
              auVar42 = vmaxps_avx(auVar42,auVar47);
              fVar197 = auVar53._0_4_;
              auVar203._0_4_ = fVar197 * auVar48._0_4_;
              auVar203._4_4_ = fVar197 * auVar48._4_4_;
              auVar203._8_4_ = fVar197 * auVar48._8_4_;
              auVar203._12_4_ = fVar197 * auVar48._12_4_;
              auVar190._0_4_ = fVar197 * auVar42._0_4_;
              auVar190._4_4_ = fVar197 * auVar42._4_4_;
              auVar190._8_4_ = fVar197 * auVar42._8_4_;
              auVar190._12_4_ = fVar197 * auVar42._12_4_;
              auVar56 = vinsertps_avx(auVar34,auVar49,0x10);
              auVar57 = vpermt2ps_avx512vl(auVar34,_DAT_01feecd0,auVar50);
              auVar107._0_4_ = auVar56._0_4_ + auVar57._0_4_;
              auVar107._4_4_ = auVar56._4_4_ + auVar57._4_4_;
              auVar107._8_4_ = auVar56._8_4_ + auVar57._8_4_;
              auVar107._12_4_ = auVar56._12_4_ + auVar57._12_4_;
              auVar13._8_4_ = 0x3f000000;
              auVar13._0_8_ = 0x3f0000003f000000;
              auVar13._12_4_ = 0x3f000000;
              auVar53 = vmulps_avx512vl(auVar107,auVar13);
              auVar47 = vshufps_avx(auVar53,auVar53,0x54);
              uVar102 = auVar53._0_4_;
              auVar117._4_4_ = uVar102;
              auVar117._0_4_ = uVar102;
              auVar117._8_4_ = uVar102;
              auVar117._12_4_ = uVar102;
              auVar58 = vfmadd213ps_avx512vl(auVar33,auVar117,auVar35);
              auVar51 = vfmadd213ps_avx512vl(local_178,auVar117,auVar44);
              auVar48 = vfmadd213ps_fma(local_188,auVar117,local_328);
              auVar42 = vsubps_avx(auVar51,auVar58);
              auVar58 = vfmadd213ps_fma(auVar42,auVar117,auVar58);
              auVar42 = vsubps_avx(auVar48,auVar51);
              auVar42 = vfmadd213ps_fma(auVar42,auVar117,auVar51);
              auVar42 = vsubps_avx(auVar42,auVar58);
              auVar48 = vfmadd231ps_fma(auVar58,auVar42,auVar117);
              auVar52 = vmulps_avx512vl(auVar42,auVar229);
              auVar213._8_8_ = auVar48._0_8_;
              auVar213._0_8_ = auVar48._0_8_;
              auVar42 = vshufpd_avx(auVar48,auVar48,3);
              auVar48 = vshufps_avx(auVar53,auVar53,0x55);
              auVar58 = vsubps_avx(auVar42,auVar213);
              auVar51 = vfmadd231ps_fma(auVar213,auVar48,auVar58);
              auVar225._8_8_ = auVar52._0_8_;
              auVar225._0_8_ = auVar52._0_8_;
              auVar42 = vshufpd_avx(auVar52,auVar52,3);
              auVar42 = vsubps_avx512vl(auVar42,auVar225);
              auVar42 = vfmadd213ps_avx512vl(auVar42,auVar48,auVar225);
              auVar118._0_8_ = auVar58._0_8_ ^ 0x8000000080000000;
              auVar118._8_4_ = auVar58._8_4_ ^ 0x80000000;
              auVar118._12_4_ = auVar58._12_4_ ^ 0x80000000;
              auVar48 = vmovshdup_avx512vl(auVar42);
              auVar226._0_8_ = auVar48._0_8_ ^ 0x8000000080000000;
              auVar226._8_4_ = auVar48._8_4_ ^ 0x80000000;
              auVar226._12_4_ = auVar48._12_4_ ^ 0x80000000;
              auVar52 = vmovshdup_avx512vl(auVar58);
              auVar55 = vpermt2ps_avx512vl(auVar226,ZEXT416(5),auVar58);
              auVar59 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
              auVar237 = ZEXT1664(auVar59);
              auVar48 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar48._0_4_ * auVar58._0_4_)),auVar42,
                                            auVar52);
              auVar58 = vpermt2ps_avx512vl(auVar42,SUB6416(ZEXT464(4),0),auVar118);
              auVar137._0_4_ = auVar48._0_4_;
              auVar137._4_4_ = auVar137._0_4_;
              auVar137._8_4_ = auVar137._0_4_;
              auVar137._12_4_ = auVar137._0_4_;
              auVar42 = vdivps_avx(auVar55,auVar137);
              auVar60 = vdivps_avx512vl(auVar58,auVar137);
              fVar197 = auVar51._0_4_;
              auVar48 = vshufps_avx(auVar51,auVar51,0x55);
              auVar214._0_4_ = fVar197 * auVar42._0_4_ + auVar48._0_4_ * auVar60._0_4_;
              auVar214._4_4_ = fVar197 * auVar42._4_4_ + auVar48._4_4_ * auVar60._4_4_;
              auVar214._8_4_ = fVar197 * auVar42._8_4_ + auVar48._8_4_ * auVar60._8_4_;
              auVar214._12_4_ = fVar197 * auVar42._12_4_ + auVar48._12_4_ * auVar60._12_4_;
              auVar54 = vsubps_avx(auVar47,auVar214);
              auVar48 = vmovshdup_avx(auVar42);
              auVar47 = vinsertps_avx(auVar172,auVar203,0x1c);
              auVar227._0_4_ = auVar48._0_4_ * auVar47._0_4_;
              auVar227._4_4_ = auVar48._4_4_ * auVar47._4_4_;
              auVar227._8_4_ = auVar48._8_4_ * auVar47._8_4_;
              auVar227._12_4_ = auVar48._12_4_ * auVar47._12_4_;
              auVar62 = vinsertps_avx512f(auVar162,auVar190,0x1c);
              auVar48 = vmulps_avx512vl(auVar48,auVar62);
              auVar55 = vminps_avx512vl(auVar227,auVar48);
              auVar51 = vmaxps_avx(auVar48,auVar227);
              auVar52 = vmovshdup_avx(auVar60);
              auVar48 = vinsertps_avx(auVar203,auVar172,0x4c);
              auVar204._0_4_ = auVar52._0_4_ * auVar48._0_4_;
              auVar204._4_4_ = auVar52._4_4_ * auVar48._4_4_;
              auVar204._8_4_ = auVar52._8_4_ * auVar48._8_4_;
              auVar204._12_4_ = auVar52._12_4_ * auVar48._12_4_;
              auVar58 = vinsertps_avx(auVar190,auVar162,0x4c);
              auVar191._0_4_ = auVar52._0_4_ * auVar58._0_4_;
              auVar191._4_4_ = auVar52._4_4_ * auVar58._4_4_;
              auVar191._8_4_ = auVar52._8_4_ * auVar58._8_4_;
              auVar191._12_4_ = auVar52._12_4_ * auVar58._12_4_;
              auVar52 = vminps_avx(auVar204,auVar191);
              auVar55 = vaddps_avx512vl(auVar55,auVar52);
              auVar52 = vmaxps_avx(auVar191,auVar204);
              auVar192._0_4_ = auVar51._0_4_ + auVar52._0_4_;
              auVar192._4_4_ = auVar51._4_4_ + auVar52._4_4_;
              auVar192._8_4_ = auVar51._8_4_ + auVar52._8_4_;
              auVar192._12_4_ = auVar51._12_4_ + auVar52._12_4_;
              auVar205._8_8_ = 0x3f80000000000000;
              auVar205._0_8_ = 0x3f80000000000000;
              auVar51 = vsubps_avx(auVar205,auVar192);
              auVar52 = vsubps_avx(auVar205,auVar55);
              auVar55 = vsubps_avx(auVar56,auVar53);
              auVar53 = vsubps_avx(auVar57,auVar53);
              fVar198 = auVar55._0_4_;
              auVar228._0_4_ = fVar198 * auVar51._0_4_;
              fVar208 = auVar55._4_4_;
              auVar228._4_4_ = fVar208 * auVar51._4_4_;
              fVar209 = auVar55._8_4_;
              auVar228._8_4_ = fVar209 * auVar51._8_4_;
              fVar210 = auVar55._12_4_;
              auVar228._12_4_ = fVar210 * auVar51._12_4_;
              auVar61 = vbroadcastss_avx512vl(auVar42);
              auVar47 = vmulps_avx512vl(auVar61,auVar47);
              auVar62 = vmulps_avx512vl(auVar61,auVar62);
              auVar61 = vminps_avx512vl(auVar47,auVar62);
              auVar62 = vmaxps_avx512vl(auVar62,auVar47);
              auVar47 = vbroadcastss_avx512vl(auVar60);
              auVar48 = vmulps_avx512vl(auVar47,auVar48);
              auVar47 = vmulps_avx512vl(auVar47,auVar58);
              auVar58 = vminps_avx512vl(auVar48,auVar47);
              auVar58 = vaddps_avx512vl(auVar61,auVar58);
              auVar55 = vmulps_avx512vl(auVar55,auVar52);
              fVar197 = auVar53._0_4_;
              auVar193._0_4_ = fVar197 * auVar51._0_4_;
              fVar186 = auVar53._4_4_;
              auVar193._4_4_ = fVar186 * auVar51._4_4_;
              fVar195 = auVar53._8_4_;
              auVar193._8_4_ = fVar195 * auVar51._8_4_;
              fVar196 = auVar53._12_4_;
              auVar193._12_4_ = fVar196 * auVar51._12_4_;
              auVar206._0_4_ = fVar197 * auVar52._0_4_;
              auVar206._4_4_ = fVar186 * auVar52._4_4_;
              auVar206._8_4_ = fVar195 * auVar52._8_4_;
              auVar206._12_4_ = fVar196 * auVar52._12_4_;
              auVar47 = vmaxps_avx(auVar47,auVar48);
              auVar163._0_4_ = auVar62._0_4_ + auVar47._0_4_;
              auVar163._4_4_ = auVar62._4_4_ + auVar47._4_4_;
              auVar163._8_4_ = auVar62._8_4_ + auVar47._8_4_;
              auVar163._12_4_ = auVar62._12_4_ + auVar47._12_4_;
              auVar173._8_8_ = 0x3f800000;
              auVar173._0_8_ = 0x3f800000;
              auVar47 = vsubps_avx(auVar173,auVar163);
              auVar48 = vsubps_avx512vl(auVar173,auVar58);
              auVar223._0_4_ = fVar198 * auVar47._0_4_;
              auVar223._4_4_ = fVar208 * auVar47._4_4_;
              auVar223._8_4_ = fVar209 * auVar47._8_4_;
              auVar223._12_4_ = fVar210 * auVar47._12_4_;
              auVar215._0_4_ = fVar198 * auVar48._0_4_;
              auVar215._4_4_ = fVar208 * auVar48._4_4_;
              auVar215._8_4_ = fVar209 * auVar48._8_4_;
              auVar215._12_4_ = fVar210 * auVar48._12_4_;
              auVar164._0_4_ = fVar197 * auVar47._0_4_;
              auVar164._4_4_ = fVar186 * auVar47._4_4_;
              auVar164._8_4_ = fVar195 * auVar47._8_4_;
              auVar164._12_4_ = fVar196 * auVar47._12_4_;
              auVar174._0_4_ = fVar197 * auVar48._0_4_;
              auVar174._4_4_ = fVar186 * auVar48._4_4_;
              auVar174._8_4_ = fVar195 * auVar48._8_4_;
              auVar174._12_4_ = fVar196 * auVar48._12_4_;
              auVar47 = vminps_avx(auVar223,auVar215);
              auVar48 = vminps_avx512vl(auVar164,auVar174);
              auVar58 = vminps_avx512vl(auVar47,auVar48);
              auVar47 = vmaxps_avx(auVar215,auVar223);
              auVar48 = vmaxps_avx(auVar174,auVar164);
              auVar48 = vmaxps_avx(auVar48,auVar47);
              auVar51 = vminps_avx512vl(auVar228,auVar55);
              auVar47 = vminps_avx(auVar193,auVar206);
              auVar47 = vminps_avx(auVar51,auVar47);
              auVar47 = vhaddps_avx(auVar58,auVar47);
              auVar51 = vmaxps_avx512vl(auVar55,auVar228);
              auVar58 = vmaxps_avx(auVar206,auVar193);
              auVar58 = vmaxps_avx(auVar58,auVar51);
              auVar48 = vhaddps_avx(auVar48,auVar58);
              auVar47 = vshufps_avx(auVar47,auVar47,0xe8);
              auVar48 = vshufps_avx(auVar48,auVar48,0xe8);
              auVar165._0_4_ = auVar47._0_4_ + auVar54._0_4_;
              auVar165._4_4_ = auVar47._4_4_ + auVar54._4_4_;
              auVar165._8_4_ = auVar47._8_4_ + auVar54._8_4_;
              auVar165._12_4_ = auVar47._12_4_ + auVar54._12_4_;
              auVar175._0_4_ = auVar48._0_4_ + auVar54._0_4_;
              auVar175._4_4_ = auVar48._4_4_ + auVar54._4_4_;
              auVar175._8_4_ = auVar48._8_4_ + auVar54._8_4_;
              auVar175._12_4_ = auVar48._12_4_ + auVar54._12_4_;
              auVar47 = vmaxps_avx(auVar56,auVar165);
              auVar48 = vminps_avx(auVar175,auVar57);
              uVar32 = vcmpps_avx512vl(auVar48,auVar47,1);
              if ((uVar32 & 3) == 0) {
                uVar32 = vcmpps_avx512vl(auVar175,auVar57,1);
                uVar9 = vcmpps_avx512vl(auVar34,auVar165,1);
                if (((ushort)uVar9 & (ushort)uVar32 & 1) == 0) {
                  bVar19 = 0;
                }
                else {
                  auVar47 = vmovshdup_avx(auVar165);
                  bVar19 = auVar49._0_4_ < auVar47._0_4_ & (byte)(uVar32 >> 1) & 0x7f;
                }
                if (((3 < uVar20 || uVar4 != 0 && !bVar29) | bVar19) != 1) {
                  auVar61 = vinsertps_avx(auVar49,auVar50,0x10);
                  goto LAB_01aaae91;
                }
                lVar23 = 200;
                do {
                  auVar34 = vsubss_avx512f(auVar43,auVar54);
                  fVar195 = auVar34._0_4_;
                  fVar197 = fVar195 * fVar195 * fVar195;
                  fVar196 = auVar54._0_4_;
                  fVar186 = fVar196 * 3.0 * fVar195 * fVar195;
                  fVar195 = fVar195 * fVar196 * fVar196 * 3.0;
                  auVar127._4_4_ = fVar197;
                  auVar127._0_4_ = fVar197;
                  auVar127._8_4_ = fVar197;
                  auVar127._12_4_ = fVar197;
                  auVar124._4_4_ = fVar186;
                  auVar124._0_4_ = fVar186;
                  auVar124._8_4_ = fVar186;
                  auVar124._12_4_ = fVar186;
                  auVar98._4_4_ = fVar195;
                  auVar98._0_4_ = fVar195;
                  auVar98._8_4_ = fVar195;
                  auVar98._12_4_ = fVar195;
                  fVar196 = fVar196 * fVar196 * fVar196;
                  auVar148._0_4_ = fVar196 * (float)local_158._0_4_;
                  auVar148._4_4_ = fVar196 * (float)local_158._4_4_;
                  auVar148._8_4_ = fVar196 * fStack_150;
                  auVar148._12_4_ = fVar196 * fStack_14c;
                  auVar34 = vfmadd231ps_fma(auVar148,local_328,auVar98);
                  auVar34 = vfmadd231ps_fma(auVar34,auVar44,auVar124);
                  auVar34 = vfmadd231ps_fma(auVar34,auVar35,auVar127);
                  auVar99._8_8_ = auVar34._0_8_;
                  auVar99._0_8_ = auVar34._0_8_;
                  auVar34 = vshufpd_avx(auVar34,auVar34,3);
                  auVar47 = vshufps_avx(auVar54,auVar54,0x55);
                  auVar34 = vsubps_avx(auVar34,auVar99);
                  auVar47 = vfmadd213ps_fma(auVar34,auVar47,auVar99);
                  fVar197 = auVar47._0_4_;
                  auVar34 = vshufps_avx(auVar47,auVar47,0x55);
                  auVar100._0_4_ = auVar42._0_4_ * fVar197 + auVar60._0_4_ * auVar34._0_4_;
                  auVar100._4_4_ = auVar42._4_4_ * fVar197 + auVar60._4_4_ * auVar34._4_4_;
                  auVar100._8_4_ = auVar42._8_4_ * fVar197 + auVar60._8_4_ * auVar34._8_4_;
                  auVar100._12_4_ = auVar42._12_4_ * fVar197 + auVar60._12_4_ * auVar34._12_4_;
                  auVar54 = vsubps_avx(auVar54,auVar100);
                  auVar34 = vandps_avx512vl(auVar47,auVar235._0_16_);
                  auVar47 = vprolq_avx512vl(auVar34,0x20);
                  auVar34 = vmaxss_avx(auVar47,auVar34);
                  bVar29 = (float)local_168._0_4_ < auVar34._0_4_;
                  if (auVar34._0_4_ < (float)local_168._0_4_) {
                    auVar34 = vucomiss_avx512f(auVar59);
                    if (bVar29) break;
                    auVar42 = vucomiss_avx512f(auVar34);
                    auVar238 = ZEXT1664(auVar42);
                    if (bVar29) break;
                    vmovshdup_avx(auVar34);
                    auVar42 = vucomiss_avx512f(auVar59);
                    if (bVar29) break;
                    auVar43 = vucomiss_avx512f(auVar42);
                    auVar238 = ZEXT1664(auVar43);
                    if (bVar29) break;
                    auVar47 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar53 = vinsertps_avx(auVar47,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                  [2]),0x28);
                    auVar47 = vdpps_avx(auVar53,local_198,0x7f);
                    auVar48 = vdpps_avx(auVar53,local_1a8,0x7f);
                    auVar56 = vdpps_avx(auVar53,local_1b8,0x7f);
                    auVar58 = vdpps_avx(auVar53,local_1c8,0x7f);
                    auVar51 = vdpps_avx(auVar53,local_1d8,0x7f);
                    auVar52 = vdpps_avx(auVar53,local_1e8,0x7f);
                    auVar55 = vdpps_avx(auVar53,local_1f8,0x7f);
                    auVar53 = vdpps_avx(auVar53,local_208,0x7f);
                    auVar54 = vsubss_avx512f(auVar43,auVar42);
                    fVar196 = auVar42._0_4_;
                    auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar196 * auVar51._0_4_)),auVar54,
                                              auVar47);
                    auVar47 = vfmadd231ss_fma(ZEXT416((uint)(auVar52._0_4_ * fVar196)),auVar54,
                                              auVar48);
                    auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar55._0_4_ * fVar196)),auVar54,
                                              auVar56);
                    auVar56 = vfmadd231ss_fma(ZEXT416((uint)(fVar196 * auVar53._0_4_)),auVar54,
                                              auVar58);
                    auVar43 = vsubss_avx512f(auVar43,auVar34);
                    auVar176._0_4_ = auVar43._0_4_;
                    fVar197 = auVar176._0_4_ * auVar176._0_4_ * auVar176._0_4_;
                    local_d8 = auVar34._0_4_;
                    fVar186 = local_d8 * 3.0 * auVar176._0_4_ * auVar176._0_4_;
                    fVar195 = auVar176._0_4_ * local_d8 * local_d8 * 3.0;
                    fVar208 = local_d8 * local_d8 * local_d8;
                    auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * auVar56._0_4_)),
                                              ZEXT416((uint)fVar195),auVar48);
                    auVar43 = vfmadd231ss_fma(auVar43,ZEXT416((uint)fVar186),auVar47);
                    auVar42 = vfmadd231ss_fma(auVar43,ZEXT416((uint)fVar197),auVar42);
                    fVar198 = auVar42._0_4_;
                    if ((fVar198 < fVar95) ||
                       (fVar209 = *(float *)(ray + k * 4 + 0x80), fVar209 < fVar198)) break;
                    local_c8 = vshufps_avx(auVar34,auVar34,0x55);
                    auVar43 = vsubps_avx512vl(auVar38,local_c8);
                    fVar210 = local_c8._0_4_;
                    auVar182._0_4_ = fVar210 * (float)local_228._0_4_;
                    fVar211 = local_c8._4_4_;
                    auVar182._4_4_ = fVar211 * (float)local_228._4_4_;
                    fVar218 = local_c8._8_4_;
                    auVar182._8_4_ = fVar218 * fStack_220;
                    fVar219 = local_c8._12_4_;
                    auVar182._12_4_ = fVar219 * fStack_21c;
                    auVar194._0_4_ = fVar210 * (float)local_278._0_4_;
                    auVar194._4_4_ = fVar211 * (float)local_278._4_4_;
                    auVar194._8_4_ = fVar218 * fStack_270;
                    auVar194._12_4_ = fVar219 * fStack_26c;
                    auVar207._0_4_ = fVar210 * (float)local_288._0_4_;
                    auVar207._4_4_ = fVar211 * (float)local_288._4_4_;
                    auVar207._8_4_ = fVar218 * fStack_280;
                    auVar207._12_4_ = fVar219 * fStack_27c;
                    auVar216._0_4_ = fVar210 * (float)local_248._0_4_;
                    auVar216._4_4_ = fVar211 * (float)local_248._4_4_;
                    auVar216._8_4_ = fVar218 * fStack_240;
                    auVar216._12_4_ = fVar219 * fStack_23c;
                    auVar34 = vfmadd231ps_fma(auVar182,auVar43,local_218);
                    auVar38 = vfmadd231ps_fma(auVar194,auVar43,local_258);
                    auVar42 = vfmadd231ps_fma(auVar207,auVar43,local_268);
                    auVar43 = vfmadd231ps_fma(auVar216,auVar43,local_238);
                    auVar34 = vsubps_avx(auVar38,auVar34);
                    auVar38 = vsubps_avx(auVar42,auVar38);
                    auVar42 = vsubps_avx(auVar43,auVar42);
                    auVar217._0_4_ = local_d8 * auVar38._0_4_;
                    auVar217._4_4_ = local_d8 * auVar38._4_4_;
                    auVar217._8_4_ = local_d8 * auVar38._8_4_;
                    auVar217._12_4_ = local_d8 * auVar38._12_4_;
                    auVar176._4_4_ = auVar176._0_4_;
                    auVar176._8_4_ = auVar176._0_4_;
                    auVar176._12_4_ = auVar176._0_4_;
                    auVar34 = vfmadd231ps_fma(auVar217,auVar176,auVar34);
                    auVar183._0_4_ = local_d8 * auVar42._0_4_;
                    auVar183._4_4_ = local_d8 * auVar42._4_4_;
                    auVar183._8_4_ = local_d8 * auVar42._8_4_;
                    auVar183._12_4_ = local_d8 * auVar42._12_4_;
                    auVar38 = vfmadd231ps_fma(auVar183,auVar176,auVar38);
                    auVar184._0_4_ = local_d8 * auVar38._0_4_;
                    auVar184._4_4_ = local_d8 * auVar38._4_4_;
                    auVar184._8_4_ = local_d8 * auVar38._8_4_;
                    auVar184._12_4_ = local_d8 * auVar38._12_4_;
                    auVar34 = vfmadd231ps_fma(auVar184,auVar176,auVar34);
                    auVar34 = vmulps_avx512vl(auVar34,auVar229);
                    pGVar5 = (context->scene->geometries).items[uVar26].ptr;
                    if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
                    auVar156._0_4_ = fVar208 * (float)local_2c8._0_4_;
                    auVar156._4_4_ = fVar208 * (float)local_2c8._4_4_;
                    auVar156._8_4_ = fVar208 * fStack_2c0;
                    auVar156._12_4_ = fVar208 * fStack_2bc;
                    auVar149._4_4_ = fVar195;
                    auVar149._0_4_ = fVar195;
                    auVar149._8_4_ = fVar195;
                    auVar149._12_4_ = fVar195;
                    auVar229 = vfmadd132ps_fma(auVar149,auVar156,local_2b8);
                    auVar138._4_4_ = fVar186;
                    auVar138._0_4_ = fVar186;
                    auVar138._8_4_ = fVar186;
                    auVar138._12_4_ = fVar186;
                    auVar229 = vfmadd132ps_fma(auVar138,auVar229,local_2a8);
                    auVar128._4_4_ = fVar197;
                    auVar128._0_4_ = fVar197;
                    auVar128._8_4_ = fVar197;
                    auVar128._12_4_ = fVar197;
                    auVar42 = vfmadd132ps_fma(auVar128,auVar229,local_298);
                    auVar229 = vshufps_avx(auVar42,auVar42,0xc9);
                    auVar38 = vshufps_avx(auVar34,auVar34,0xc9);
                    auVar129._0_4_ = auVar42._0_4_ * auVar38._0_4_;
                    auVar129._4_4_ = auVar42._4_4_ * auVar38._4_4_;
                    auVar129._8_4_ = auVar42._8_4_ * auVar38._8_4_;
                    auVar129._12_4_ = auVar42._12_4_ * auVar38._12_4_;
                    auVar34 = vfmsub231ps_fma(auVar129,auVar34,auVar229);
                    local_e8 = auVar34._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x80) = fVar198;
                      uVar102 = vextractps_avx(auVar34,1);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = uVar102;
                      uVar102 = vextractps_avx(auVar34,2);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = uVar102;
                      *(undefined4 *)(ray + k * 4 + 0xe0) = local_e8;
                      *(float *)(ray + k * 4 + 0xf0) = local_d8;
                      *(float *)(ray + k * 4 + 0x100) = fVar196;
                      *(int *)(ray + k * 4 + 0x110) = (int)local_368;
                      *(uint *)(ray + k * 4 + 0x120) = uVar26;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      break;
                    }
                    auVar229 = vshufps_avx(auVar34,auVar34,0x55);
                    local_f8 = vshufps_avx(auVar34,auVar34,0xaa);
                    local_108[0] = (RTCHitN)auVar229[0];
                    local_108[1] = (RTCHitN)auVar229[1];
                    local_108[2] = (RTCHitN)auVar229[2];
                    local_108[3] = (RTCHitN)auVar229[3];
                    local_108[4] = (RTCHitN)auVar229[4];
                    local_108[5] = (RTCHitN)auVar229[5];
                    local_108[6] = (RTCHitN)auVar229[6];
                    local_108[7] = (RTCHitN)auVar229[7];
                    local_108[8] = (RTCHitN)auVar229[8];
                    local_108[9] = (RTCHitN)auVar229[9];
                    local_108[10] = (RTCHitN)auVar229[10];
                    local_108[0xb] = (RTCHitN)auVar229[0xb];
                    local_108[0xc] = (RTCHitN)auVar229[0xc];
                    local_108[0xd] = (RTCHitN)auVar229[0xd];
                    local_108[0xe] = (RTCHitN)auVar229[0xe];
                    local_108[0xf] = (RTCHitN)auVar229[0xf];
                    uStack_e4 = local_e8;
                    uStack_e0 = local_e8;
                    uStack_dc = local_e8;
                    fStack_d4 = local_d8;
                    fStack_d0 = local_d8;
                    fStack_cc = local_d8;
                    local_b8 = local_2f8._0_8_;
                    uStack_b0 = local_2f8._8_8_;
                    local_a8 = local_2e8;
                    vpcmpeqd_avx2(ZEXT1632(local_2e8),ZEXT1632(local_2e8));
                    uStack_94 = context->user->instID[0];
                    local_98 = uStack_94;
                    uStack_90 = uStack_94;
                    uStack_8c = uStack_94;
                    uStack_88 = context->user->instPrimID[0];
                    uStack_84 = uStack_88;
                    uStack_80 = uStack_88;
                    uStack_7c = uStack_88;
                    *(float *)(ray + k * 4 + 0x80) = fVar198;
                    local_388 = local_308;
                    local_358.valid = (int *)local_388;
                    local_358.geometryUserPtr = pGVar5->userPtr;
                    local_358.context = context->user;
                    local_358.hit = local_108;
                    local_358.N = 4;
                    local_358.ray = (RTCRayN *)ray;
                    if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      local_370 = context;
                      (*pGVar5->intersectionFilterN)(&local_358);
                      auVar34 = vxorps_avx512vl(auVar59,auVar59);
                      auVar237 = ZEXT1664(auVar34);
                      auVar238 = ZEXT464(0x3f800000);
                      auVar234 = ZEXT3264(_DAT_01feed20);
                      auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar233 = ZEXT1664(auVar34);
                      auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar232 = ZEXT3264(auVar80);
                      auVar34 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar231 = ZEXT1664(auVar34);
                      auVar34 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar230 = ZEXT1664(auVar34);
                      auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar236 = ZEXT1664(auVar34);
                      auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar235 = ZEXT1664(auVar34);
                      context = local_370;
                    }
                    auVar34 = auVar237._0_16_;
                    uVar32 = vptestmd_avx512vl(local_388,local_388);
                    if ((uVar32 & 0xf) != 0) {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var8)(&local_358);
                        auVar34 = vxorps_avx512vl(auVar34,auVar34);
                        auVar237 = ZEXT1664(auVar34);
                        auVar238 = ZEXT464(0x3f800000);
                        auVar234 = ZEXT3264(_DAT_01feed20);
                        auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar233 = ZEXT1664(auVar34);
                        auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar232 = ZEXT3264(auVar80);
                        auVar34 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar231 = ZEXT1664(auVar34);
                        auVar34 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar230 = ZEXT1664(auVar34);
                        auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar236 = ZEXT1664(auVar34);
                        auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar235 = ZEXT1664(auVar34);
                      }
                      uVar32 = vptestmd_avx512vl(local_388,local_388);
                      uVar32 = uVar32 & 0xf;
                      bVar19 = (byte)uVar32;
                      if (bVar19 != 0) {
                        iVar16 = *(int *)(local_358.hit + 4);
                        iVar17 = *(int *)(local_358.hit + 8);
                        iVar18 = *(int *)(local_358.hit + 0xc);
                        bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
                        bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
                        bVar27 = SUB81(uVar32 >> 3,0);
                        *(uint *)(local_358.ray + 0xc0) =
                             (uint)(bVar19 & 1) * *(int *)local_358.hit |
                             (uint)!(bool)(bVar19 & 1) * *(int *)(local_358.ray + 0xc0);
                        *(uint *)(local_358.ray + 0xc4) =
                             (uint)bVar29 * iVar16 | (uint)!bVar29 * *(int *)(local_358.ray + 0xc4);
                        *(uint *)(local_358.ray + 200) =
                             (uint)bVar30 * iVar17 | (uint)!bVar30 * *(int *)(local_358.ray + 200);
                        *(uint *)(local_358.ray + 0xcc) =
                             (uint)bVar27 * iVar18 | (uint)!bVar27 * *(int *)(local_358.ray + 0xcc);
                        iVar16 = *(int *)(local_358.hit + 0x14);
                        iVar17 = *(int *)(local_358.hit + 0x18);
                        iVar18 = *(int *)(local_358.hit + 0x1c);
                        bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
                        bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
                        bVar27 = SUB81(uVar32 >> 3,0);
                        *(uint *)(local_358.ray + 0xd0) =
                             (uint)(bVar19 & 1) * *(int *)(local_358.hit + 0x10) |
                             (uint)!(bool)(bVar19 & 1) * *(int *)(local_358.ray + 0xd0);
                        *(uint *)(local_358.ray + 0xd4) =
                             (uint)bVar29 * iVar16 | (uint)!bVar29 * *(int *)(local_358.ray + 0xd4);
                        *(uint *)(local_358.ray + 0xd8) =
                             (uint)bVar30 * iVar17 | (uint)!bVar30 * *(int *)(local_358.ray + 0xd8);
                        *(uint *)(local_358.ray + 0xdc) =
                             (uint)bVar27 * iVar18 | (uint)!bVar27 * *(int *)(local_358.ray + 0xdc);
                        iVar16 = *(int *)(local_358.hit + 0x24);
                        iVar17 = *(int *)(local_358.hit + 0x28);
                        iVar18 = *(int *)(local_358.hit + 0x2c);
                        bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
                        bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
                        bVar27 = SUB81(uVar32 >> 3,0);
                        *(uint *)(local_358.ray + 0xe0) =
                             (uint)(bVar19 & 1) * *(int *)(local_358.hit + 0x20) |
                             (uint)!(bool)(bVar19 & 1) * *(int *)(local_358.ray + 0xe0);
                        *(uint *)(local_358.ray + 0xe4) =
                             (uint)bVar29 * iVar16 | (uint)!bVar29 * *(int *)(local_358.ray + 0xe4);
                        *(uint *)(local_358.ray + 0xe8) =
                             (uint)bVar30 * iVar17 | (uint)!bVar30 * *(int *)(local_358.ray + 0xe8);
                        *(uint *)(local_358.ray + 0xec) =
                             (uint)bVar27 * iVar18 | (uint)!bVar27 * *(int *)(local_358.ray + 0xec);
                        iVar16 = *(int *)(local_358.hit + 0x34);
                        iVar17 = *(int *)(local_358.hit + 0x38);
                        iVar18 = *(int *)(local_358.hit + 0x3c);
                        bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
                        bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
                        bVar27 = SUB81(uVar32 >> 3,0);
                        *(uint *)(local_358.ray + 0xf0) =
                             (uint)(bVar19 & 1) * *(int *)(local_358.hit + 0x30) |
                             (uint)!(bool)(bVar19 & 1) * *(int *)(local_358.ray + 0xf0);
                        *(uint *)(local_358.ray + 0xf4) =
                             (uint)bVar29 * iVar16 | (uint)!bVar29 * *(int *)(local_358.ray + 0xf4);
                        *(uint *)(local_358.ray + 0xf8) =
                             (uint)bVar30 * iVar17 | (uint)!bVar30 * *(int *)(local_358.ray + 0xf8);
                        *(uint *)(local_358.ray + 0xfc) =
                             (uint)bVar27 * iVar18 | (uint)!bVar27 * *(int *)(local_358.ray + 0xfc);
                        iVar16 = *(int *)(local_358.hit + 0x44);
                        iVar17 = *(int *)(local_358.hit + 0x48);
                        iVar18 = *(int *)(local_358.hit + 0x4c);
                        bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
                        bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
                        bVar27 = SUB81(uVar32 >> 3,0);
                        *(uint *)(local_358.ray + 0x100) =
                             (uint)(bVar19 & 1) * *(int *)(local_358.hit + 0x40) |
                             (uint)!(bool)(bVar19 & 1) * *(int *)(local_358.ray + 0x100);
                        *(uint *)(local_358.ray + 0x104) =
                             (uint)bVar29 * iVar16 | (uint)!bVar29 * *(int *)(local_358.ray + 0x104)
                        ;
                        *(uint *)(local_358.ray + 0x108) =
                             (uint)bVar30 * iVar17 | (uint)!bVar30 * *(int *)(local_358.ray + 0x108)
                        ;
                        *(uint *)(local_358.ray + 0x10c) =
                             (uint)bVar27 * iVar18 | (uint)!bVar27 * *(int *)(local_358.ray + 0x10c)
                        ;
                        auVar34 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_358.hit + 0x50));
                        *(undefined1 (*) [16])(local_358.ray + 0x110) = auVar34;
                        auVar34 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_358.hit + 0x60));
                        *(undefined1 (*) [16])(local_358.ray + 0x120) = auVar34;
                        auVar34 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_358.hit + 0x70));
                        *(undefined1 (*) [16])(local_358.ray + 0x130) = auVar34;
                        auVar34 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_358.hit + 0x80));
                        *(undefined1 (*) [16])(local_358.ray + 0x140) = auVar34;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x80) = fVar209;
                    break;
                  }
                  lVar23 = lVar23 + -1;
                } while (lVar23 != 0);
              }
            }
          }
          if (uVar20 == 0) break;
        } while( true );
      }
      uVar102 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar14._4_4_ = uVar102;
      auVar14._0_4_ = uVar102;
      auVar14._8_4_ = uVar102;
      auVar14._12_4_ = uVar102;
      uVar9 = vcmpps_avx512vl(local_2d8,auVar14,2);
      uVar26 = (uint)uVar31 & (uint)local_360 & (uint)uVar9;
      uVar31 = (ulong)uVar26;
    } while (uVar26 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }